

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::LRN_x86_fma::forward_inplace(LRN_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [24];
  undefined8 *in_RDX;
  long *in_RSI;
  long *in_RDI;
  double dVar77;
  float fVar81;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float val;
  int k;
  float ss;
  float *sptr_1;
  int j_1;
  int i_5;
  Mat m_6;
  float *ptr_3;
  int q_2;
  int j;
  int i_4;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  float alpha_div_size_1;
  int maxk;
  Option opt_b;
  int pad;
  Mat square_blob_bordered;
  int outh;
  int outw;
  __m256 _ssp_1;
  __m256 _p_1;
  __m256 _mb;
  __m256 _ads;
  __m256 _bias;
  int i_2;
  float *ssptr;
  float *ptr_2;
  __m256 _ssp;
  __m256 _sp;
  int i_3;
  float *ssptr_1;
  float *sptr;
  int p;
  int q_1;
  float alpha_div_size;
  Mat square_sum;
  __m256 _outp;
  __m256 _p;
  int i;
  float *outptr;
  float *ptr;
  int q;
  Mat square_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  int i_1;
  float *ptr_1;
  int size_1;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  allocator_type *in_stack_ffffffffffffcbb8;
  void **ppvVar85;
  size_type in_stack_ffffffffffffcbc0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffcbc8;
  undefined8 in_stack_ffffffffffffcbd0;
  undefined4 in_stack_ffffffffffffcbd8;
  float in_stack_ffffffffffffcbdc;
  int in_stack_ffffffffffffcbe0;
  int in_stack_ffffffffffffcbe4;
  undefined8 in_stack_ffffffffffffcbe8;
  Mat *in_stack_ffffffffffffcbf0;
  Mat *in_stack_ffffffffffffcbf8;
  int in_stack_ffffffffffffcc08;
  Option *in_stack_ffffffffffffcc10;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 local_3080;
  undefined8 uStack_3078;
  bool local_2d89;
  bool local_2cd1;
  int local_2cb8;
  float local_2cb4;
  int local_2ca8;
  int local_2ca4;
  void *local_2ca0;
  int *local_2c98;
  ulong local_2c90;
  undefined4 local_2c88;
  long *local_2c80;
  int local_2c78;
  int local_2c74;
  int local_2c70;
  undefined4 local_2c6c;
  undefined4 local_2c68;
  ulong local_2c60;
  undefined8 local_2c58;
  undefined8 local_2c50;
  undefined8 local_2c48;
  undefined4 local_2c40;
  long local_2c38;
  undefined4 local_2c30;
  undefined4 local_2c2c;
  undefined4 local_2c28;
  undefined4 local_2c24;
  undefined4 local_2c20;
  undefined8 local_2c18;
  long local_2c10;
  int local_2c08;
  int local_2c04;
  int local_2c00;
  int local_2bfc;
  int local_2bf8;
  int local_2bf4;
  reference local_2bf0;
  vector<int,_std::allocator<int>_> local_2be0;
  float local_2bc8;
  int local_2bc4;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  int local_2b74;
  void *local_2b70;
  int *local_2b68;
  ulong local_2b60;
  undefined4 local_2b58;
  long *local_2b50;
  int local_2b48;
  int local_2b44;
  int local_2b40;
  undefined4 local_2b3c;
  int local_2b38;
  long local_2b30;
  int local_2b28;
  int local_2b24;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined1 local_2ae0 [32];
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  int local_2a64;
  undefined8 local_2a60;
  undefined8 local_2a58;
  undefined8 local_2a50;
  undefined4 local_2a48;
  long *local_2a40;
  undefined4 local_2a38;
  undefined4 local_2a34;
  undefined4 local_2a30;
  undefined4 local_2a2c;
  undefined4 local_2a28;
  undefined8 local_2a20;
  uint *local_2a18;
  undefined8 local_2a10;
  undefined8 local_2a08;
  undefined8 local_2a00;
  undefined4 local_29f8;
  long local_29f0;
  undefined4 local_29e8;
  undefined4 local_29e4;
  undefined4 local_29e0;
  undefined4 local_29dc;
  undefined4 local_29d8;
  undefined8 local_29d0;
  undefined1 (*local_29c8) [32];
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  int local_297c;
  undefined8 local_2978;
  undefined8 local_2970;
  undefined8 local_2968;
  undefined4 local_2960;
  long *local_2958;
  undefined4 local_2950;
  undefined4 local_294c;
  undefined4 local_2948;
  undefined4 local_2944;
  undefined4 local_2940;
  undefined8 local_2938;
  undefined1 (*local_2930) [32];
  undefined8 local_2928;
  undefined8 local_2920;
  undefined8 local_2918;
  undefined4 local_2910;
  long *local_2908;
  undefined4 local_2900;
  undefined4 local_28fc;
  undefined4 local_28f8;
  undefined4 local_28f4;
  undefined4 local_28f0;
  undefined8 local_28e8;
  float *local_28e0;
  int local_28d4;
  int local_28d0;
  float local_28cc;
  undefined4 *local_28c8;
  int *local_28c0;
  long local_28b8;
  undefined4 local_28b0;
  long *local_28a8;
  undefined4 local_28a0;
  int local_289c;
  int local_2898;
  undefined4 local_2894;
  int local_2890;
  long local_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  int local_283c;
  undefined8 local_2838;
  undefined8 local_2830;
  undefined8 local_2828;
  undefined4 local_2820;
  long *local_2818;
  undefined4 local_2810;
  undefined4 local_280c;
  undefined4 local_2808;
  undefined4 local_2804;
  undefined4 local_2800;
  undefined8 local_27f8;
  undefined1 (*local_27f0) [32];
  undefined8 local_27e8;
  undefined8 local_27e0;
  undefined8 local_27d8;
  undefined4 local_27d0;
  long local_27c8;
  undefined4 local_27c0;
  undefined4 local_27bc;
  undefined4 local_27b8;
  undefined4 local_27b4;
  undefined4 local_27b0;
  undefined8 local_27a8;
  undefined1 (*local_27a0) [32];
  int local_2794;
  int local_2790;
  void *local_2780;
  int *local_2778;
  ulong local_2770;
  undefined4 local_2768;
  long *local_2760;
  int local_2758;
  int local_2754;
  int local_2750;
  undefined4 local_274c;
  int local_2748;
  long local_2740;
  int local_2734;
  long local_2730;
  int local_2724;
  int local_2720;
  int local_271c;
  undefined8 *local_2718;
  long *local_2710;
  int local_26fc;
  void **local_26f8;
  undefined4 **local_26f0;
  void **local_26e8;
  undefined4 **local_26e0;
  void **local_26d8;
  undefined1 local_26cd;
  int local_26cc;
  void **local_26c8;
  void **local_26c0;
  undefined1 local_26b5;
  int local_26b4;
  undefined8 *local_26a8;
  undefined1 local_269d;
  int local_269c;
  undefined4 **local_2698;
  undefined8 *local_2690;
  undefined1 local_2685;
  int local_2684;
  undefined8 *local_2678;
  undefined1 local_266d;
  int local_266c;
  undefined4 **local_2668;
  undefined8 *local_2660;
  undefined1 local_2655;
  int local_2654;
  void **local_2650;
  undefined8 *local_2648;
  undefined1 local_263d;
  int local_263c;
  void **local_2638;
  undefined8 *local_2630;
  undefined1 local_2625;
  int local_2624;
  undefined8 *local_2618;
  undefined8 *local_2610;
  undefined8 *local_2608;
  undefined8 *local_25c0;
  undefined8 *local_25b0;
  undefined8 *local_25a0;
  undefined8 *local_2590;
  undefined8 *local_2580;
  undefined8 *local_2570;
  undefined4 **local_2560;
  undefined8 *local_2550;
  void **local_2540;
  void **local_2530;
  void **local_2520;
  undefined8 *local_2510;
  undefined8 *local_2508;
  undefined8 *local_2500;
  undefined8 *local_24f8;
  undefined8 *local_24f0;
  uint *local_24e8;
  undefined1 (*local_24e0) [32];
  undefined1 (*local_24d8) [32];
  float *local_24d0;
  undefined1 (*local_24c8) [32];
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined1 local_2420 [8];
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  undefined4 uStack_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined1 (*local_23c8) [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined1 (*local_2388) [32];
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined1 (*local_2348) [32];
  int local_233c;
  undefined4 *local_2338;
  int local_2330;
  undefined4 local_232c;
  undefined4 **local_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  uint local_228c;
  float local_2288;
  uint local_2284;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  void **local_21f0;
  void **local_21e8;
  int local_21dc;
  void **local_21d8;
  undefined4 **local_21d0;
  void **local_21c8;
  undefined4 **local_21c0;
  void **local_21b8;
  long local_21b0;
  undefined4 local_21a4;
  long local_21a0;
  undefined1 (*local_2198) [32];
  undefined4 local_218c;
  int local_2188;
  int local_2184;
  undefined8 *local_2180;
  long *local_2178;
  undefined4 local_216c;
  ulong local_2168;
  undefined1 (*local_2160) [32];
  undefined4 local_2154;
  int local_2150;
  int local_214c;
  undefined8 *local_2148;
  long *local_2140;
  undefined4 local_2134;
  ulong local_2130;
  float *local_2128;
  undefined4 local_211c;
  int local_2118;
  int local_2114;
  undefined8 *local_2110;
  long *local_2108;
  undefined4 local_20fc;
  long local_20f8;
  undefined1 (*local_20f0) [32];
  undefined4 local_20e4;
  int local_20e0;
  int local_20dc;
  undefined8 *local_20d8;
  long local_20d0;
  undefined4 local_20c4;
  long local_20c0;
  undefined1 (*local_20b8) [32];
  undefined4 local_20ac;
  int local_20a8;
  int local_20a4;
  undefined8 *local_20a0;
  long *local_2098;
  undefined4 local_208c;
  long local_2088;
  uint *local_2080;
  undefined4 local_2074;
  int local_2070;
  int local_206c;
  undefined8 *local_2068;
  long local_2060;
  undefined4 local_2054;
  long local_2050;
  long local_2048;
  undefined4 local_203c;
  int local_2038;
  int local_2034;
  undefined8 *local_2030;
  long *local_2028;
  undefined4 local_201c;
  ulong local_2018;
  void *local_2010;
  undefined4 local_2004;
  void **local_1ff8;
  undefined4 local_1fec;
  long local_1fe8;
  undefined4 local_1fdc;
  long local_1fd8;
  undefined4 local_1fcc;
  long local_1fc8;
  undefined4 local_1fbc;
  long local_1fb8;
  undefined4 local_1fac;
  long local_1fa8;
  undefined4 local_1f9c;
  long local_1f98;
  undefined4 local_1f8c;
  long local_1f88;
  undefined4 local_1f7c;
  long local_1f78;
  int local_1f60;
  undefined4 local_1f5c;
  void **local_1f58;
  int local_1f40;
  undefined4 local_1f3c;
  void **local_1f38;
  int local_1f20;
  undefined4 local_1f1c;
  void **local_1f18;
  undefined8 *local_1ef8;
  int local_1ee0;
  undefined4 local_1edc;
  undefined4 **local_1ed8;
  undefined8 *local_1eb8;
  undefined8 *local_1e98;
  undefined8 *local_1e78;
  undefined8 *local_1e58;
  undefined8 *local_1e38;
  undefined8 *local_1e18;
  undefined4 *local_1cf0;
  void *local_1cd0;
  void *local_1cc0;
  void *local_1cb0;
  undefined1 local_1ca0 [32];
  uint local_1c80;
  uint local_1c7c;
  uint local_1c78;
  uint local_1c74;
  uint local_1c70;
  uint local_1c6c;
  uint local_1c68;
  uint local_1c64;
  undefined1 local_1c60 [32];
  float local_1c40;
  float local_1c3c;
  float local_1c38;
  float local_1c34;
  float local_1c30;
  float local_1c2c;
  float local_1c28;
  float local_1c24;
  undefined1 local_1c20 [32];
  uint local_1c00;
  uint local_1bfc;
  uint local_1bf8;
  uint local_1bf4;
  uint local_1bf0;
  uint local_1bec;
  uint local_1be8;
  uint local_1be4;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined1 local_1ba0 [32];
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined1 local_1b40 [32];
  undefined1 local_1b20 [8];
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined1 local_1b00 [8];
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined1 local_1a20 [8];
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  ulong uStack_1a08;
  float local_1a00;
  float fStack_19fc;
  float fStack_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  float fStack_19e8;
  float fStack_19e4;
  undefined1 local_19e0 [32];
  undefined1 local_19c0 [32];
  undefined1 local_19a0 [8];
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined1 local_1980 [32];
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined1 local_1920 [8];
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  ulong uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  ulong uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined1 local_f20 [32];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  ulong local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  ulong local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  ulong local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [16];
  undefined1 local_c70 [16];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined4 local_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  ulong uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  ulong local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined4 local_374;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined4 local_354;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined4 local_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined4 local_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_94;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  int local_40;
  undefined4 local_3c;
  void **local_38;
  
  local_271c = *(int *)((long)in_RSI + 0x2c);
  local_2720 = (int)in_RSI[6];
  local_2724 = (int)in_RSI[7];
  local_2730 = in_RSI[2];
  local_2734 = local_271c * local_2720;
  local_26f8 = &local_2780;
  local_2780 = (void *)0x0;
  local_2778 = (int *)0x0;
  local_2770 = 0;
  local_2768 = 0;
  local_2760 = (long *)0x0;
  local_2758 = 0;
  local_2754 = 0;
  local_2750 = 0;
  local_274c = 0;
  local_2748 = 0;
  local_2740 = 0;
  local_2718 = in_RDX;
  local_2710 = in_RSI;
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffcbdc,in_stack_ffffffffffffcbd8),
              (int)((ulong)in_stack_ffffffffffffcbd0 >> 0x20),(int)in_stack_ffffffffffffcbd0,
              (int)((ulong)in_stack_ffffffffffffcbc8 >> 0x20),in_stack_ffffffffffffcbc0,
              (Allocator *)in_stack_ffffffffffffcbb8);
  local_26d8 = &local_2780;
  if (local_2780 != (void *)0x0) {
    local_21c8 = local_26d8;
  }
  local_2cd1 = local_2780 == (void *)0x0 || local_2740 * local_2748 == 0;
  if (local_2cd1) {
    local_26fc = -100;
    local_2790 = 1;
    goto LAB_0100054c;
  }
  for (local_2794 = 0; local_2794 < local_2724; local_2794 = local_2794 + 1) {
    local_2618 = &local_27e8;
    local_2184 = *(int *)((long)local_2710 + 0x2c);
    local_2188 = (int)local_2710[6];
    local_218c = *(undefined4 *)((long)local_2710 + 0x34);
    local_2198 = (undefined1 (*) [32])
                 (*local_2710 + local_2710[8] * (long)local_2794 * local_2710[2]);
    local_21a0 = local_2710[2];
    local_21a4 = (undefined4)local_2710[3];
    local_21b0 = local_2710[4];
    local_2180 = &local_27e8;
    local_1f78 = (long)local_2184 * (long)local_2188 * local_21a0;
    local_2608 = &local_27e8;
    local_25c0 = &local_27e8;
    local_1f7c = 0x10;
    local_2624 = local_2794;
    local_2625 = 1;
    local_27e8 = 0;
    local_27d8 = 0;
    local_27d0 = 0;
    local_27bc = 0;
    local_27b8 = 0;
    local_27b4 = 0;
    local_27b0 = 0;
    local_27e0 = 0;
    local_2630 = &local_2838;
    local_2638 = &local_2780;
    local_2160 = (undefined1 (*) [32])((long)local_2780 + local_2740 * local_2794 * local_2770);
    local_2148 = &local_2838;
    local_2818 = local_2760;
    local_1f88 = (long)local_2754 * (long)local_2750 * local_2770;
    local_1f8c = 0x10;
    local_214c = local_2754;
    local_2150 = local_2750;
    local_2154 = local_274c;
    local_2168 = local_2770;
    local_216c = local_2768;
    local_2178 = local_2760;
    local_263c = local_2794;
    local_263d = 1;
    local_27a8 = 0;
    local_27c0 = 0;
    local_24f0 = &local_2838;
    local_25b0 = &local_2838;
    local_2838 = 0;
    local_2828 = 0;
    local_2820 = 0;
    local_2810 = 0;
    local_280c = 0;
    local_2808 = 0;
    local_2804 = 0;
    local_2800 = 0;
    local_27f8 = 0;
    local_2830 = 0;
    local_27f0 = local_2160;
    local_27a0 = local_2198;
    for (local_283c = 0; local_283c + 7 < local_2734; local_283c = local_283c + 8) {
      local_24c8 = local_27a0;
      local_2860 = *(undefined8 *)*local_27a0;
      uStack_2858 = *(undefined8 *)(*local_27a0 + 8);
      uStack_2850 = *(undefined8 *)(*local_27a0 + 0x10);
      auVar76 = *(undefined1 (*) [24])*local_27a0;
      uStack_2848 = *(undefined8 *)(*local_27a0 + 0x18);
      auVar8 = *local_27a0;
      local_2420._0_4_ = auVar76._0_4_;
      local_2420._4_4_ = auVar76._4_4_;
      fStack_2418 = auVar76._8_4_;
      fStack_2414 = auVar76._12_4_;
      fStack_2410 = auVar76._16_4_;
      fStack_240c = auVar76._20_4_;
      fStack_2408 = (float)uStack_2848;
      uStack_2404 = (undefined4)((ulong)uStack_2848 >> 0x20);
      local_2440._0_4_ = (float)local_2860;
      local_2440._4_4_ = (float)((ulong)local_2860 >> 0x20);
      uStack_2438._0_4_ = (float)uStack_2858;
      uStack_2438._4_4_ = (float)((ulong)uStack_2858 >> 0x20);
      uStack_2430._0_4_ = (float)uStack_2850;
      uStack_2430._4_4_ = (float)((ulong)uStack_2850 >> 0x20);
      local_2880 = CONCAT44((float)local_2420._4_4_ * local_2440._4_4_,
                            (float)local_2420._0_4_ * (float)local_2440);
      uStack_2878 = CONCAT44(fStack_2414 * uStack_2438._4_4_,fStack_2418 * (float)uStack_2438);
      uStack_2870 = CONCAT44(fStack_240c * uStack_2430._4_4_,fStack_2410 * (float)uStack_2430);
      uStack_2868 = CONCAT44(uStack_2404,fStack_2408 * fStack_2408);
      local_2348 = local_27f0;
      auVar7._8_8_ = uStack_2878;
      auVar7._0_8_ = local_2880;
      auVar7._16_8_ = uStack_2870;
      auVar7._24_8_ = uStack_2868;
      *local_27f0 = auVar7;
      local_27a0 = local_27a0 + 1;
      local_27f0 = local_27f0 + 1;
      local_2440 = local_2860;
      uStack_2438 = uStack_2858;
      uStack_2430 = uStack_2850;
      uStack_2428 = uStack_2848;
      _local_2420 = auVar8;
      local_2380 = local_2880;
      uStack_2378 = uStack_2878;
      uStack_2370 = uStack_2870;
      uStack_2368 = uStack_2868;
    }
    for (; local_283c < local_2734; local_283c = local_283c + 1) {
      *(float *)*local_27f0 = *(float *)*local_27a0 * *(float *)*local_27a0;
      local_27a0 = (undefined1 (*) [32])(*local_27a0 + 4);
      local_27f0 = (undefined1 (*) [32])(*local_27f0 + 4);
    }
    local_1e38 = local_25b0;
    local_1e18 = local_25c0;
    local_27c8 = local_21b0;
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
    local_26f0 = &local_28c8;
    local_28c8 = (undefined4 *)0x0;
    local_28c0 = (int *)0x0;
    local_28b8 = 0;
    local_28b0 = 0;
    local_28a8 = (long *)0x0;
    local_28a0 = 0;
    local_289c = 0;
    local_2898 = 0;
    local_2894 = 0;
    local_2890 = 0;
    local_2888 = 0;
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffcbdc,in_stack_ffffffffffffcbd8),
                (int)((ulong)in_stack_ffffffffffffcbd0 >> 0x20),(int)in_stack_ffffffffffffcbd0,
                (int)((ulong)in_stack_ffffffffffffcbc8 >> 0x20),in_stack_ffffffffffffcbc0,
                (Allocator *)in_stack_ffffffffffffcbb8);
    local_26e0 = &local_28c8;
    if (local_28c8 != (undefined4 *)0x0) {
      local_21c0 = local_26e0;
    }
    local_2d89 = local_28c8 != (undefined4 *)0x0 && local_2888 * local_2890 != 0;
    if (local_2d89) {
      local_2328 = &local_28c8;
      local_232c = 0;
      local_2330 = (int)local_2888 * local_2890;
      local_2338 = local_28c8;
      for (local_233c = 0; local_233c < local_2330; local_233c = local_233c + 1) {
        *local_2338 = 0;
        local_2338 = local_2338 + 1;
      }
      local_28cc = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
                   (float)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_21d0 = local_2328;
      for (local_28d0 = 0; local_28d0 < local_2724; local_28d0 = local_28d0 + 1) {
        for (local_28d4 = local_28d0 -
                          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
            local_28d4 <=
            local_28d0 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
            local_28d4 = local_28d4 + 1) {
          if ((-1 < local_28d4) && (local_28d4 < local_2724)) {
            local_2648 = &local_2928;
            local_2650 = &local_2780;
            local_2128 = (float *)((long)local_2780 + local_2740 * local_28d4 * local_2770);
            local_2110 = &local_2928;
            local_1f98 = (long)local_2754 * (long)local_2750 * local_2770;
            local_2610 = &local_2928;
            local_25a0 = &local_2928;
            local_2660 = &local_2978;
            local_2668 = &local_28c8;
            local_20f0 = (undefined1 (*) [32])
                         ((long)local_28c8 + local_2888 * local_28d0 * local_28b8);
            local_20d8 = &local_2978;
            local_1fa8 = (long)local_289c * (long)local_2898 * local_28b8;
            local_24f8 = &local_2978;
            local_2590 = &local_2978;
            local_28f0 = 0;
            local_28f4 = 0;
            local_28f8 = 0;
            local_28fc = 0;
            local_2908 = local_2760;
            local_2910 = 0;
            local_2918 = 0;
            local_2920 = 0;
            local_2928 = 0;
            local_2958 = local_28a8;
            local_1f9c = 0x10;
            local_1fac = 0x10;
            local_20dc = local_289c;
            local_20e0 = local_2898;
            local_20e4 = local_2894;
            local_20f8 = local_28b8;
            local_20fc = local_28b0;
            local_2108 = local_28a8;
            local_2114 = local_2754;
            local_2118 = local_2750;
            local_211c = local_274c;
            local_2130 = local_2770;
            local_2134 = local_2768;
            local_2140 = local_2760;
            local_2654 = local_28d4;
            local_2655 = 1;
            local_266c = local_28d0;
            local_266d = 1;
            local_28e8 = 0;
            local_2900 = 0;
            local_2978 = 0;
            local_2968 = 0;
            local_2960 = 0;
            local_2950 = 0;
            local_294c = 0;
            local_2948 = 0;
            local_2944 = 0;
            local_2940 = 0;
            local_2938 = 0;
            local_2970 = 0;
            local_2930 = local_20f0;
            local_28e0 = local_2128;
            for (local_297c = 0; local_297c + 7 < local_2734; local_297c = local_297c + 8) {
              local_24d0 = local_28e0;
              local_29a0 = *(undefined8 *)local_28e0;
              uStack_2998 = *(undefined8 *)(local_28e0 + 2);
              uStack_2990 = *(undefined8 *)(local_28e0 + 4);
              uStack_2988 = *(undefined8 *)(local_28e0 + 6);
              local_24d8 = local_2930;
              uVar12 = *(undefined8 *)*local_2930;
              uVar13 = *(undefined8 *)((long)*local_2930 + 8);
              uVar14 = *(undefined8 *)((long)*local_2930 + 0x10);
              uVar15 = *(undefined8 *)((long)*local_2930 + 0x18);
              local_22c0._0_4_ = (float)uVar12;
              local_22c0._4_4_ = (float)((ulong)uVar12 >> 0x20);
              uStack_22b8._0_4_ = (float)uVar13;
              uStack_22b8._4_4_ = (float)((ulong)uVar13 >> 0x20);
              uStack_22b0._0_4_ = (float)uVar14;
              uStack_22b0._4_4_ = (float)((ulong)uVar14 >> 0x20);
              uStack_22a8._0_4_ = (float)uVar15;
              uStack_22a8._4_4_ = (float)((ulong)uVar15 >> 0x20);
              local_22e0._0_4_ = (float)local_29a0;
              local_22e0._4_4_ = (float)((ulong)local_29a0 >> 0x20);
              uStack_22d8._0_4_ = (float)uStack_2998;
              uStack_22d8._4_4_ = (float)((ulong)uStack_2998 >> 0x20);
              uStack_22d0._0_4_ = (float)uStack_2990;
              uStack_22d0._4_4_ = (float)((ulong)uStack_2990 >> 0x20);
              uStack_22c8._0_4_ = (float)uStack_2988;
              uStack_22c8._4_4_ = (float)((ulong)uStack_2988 >> 0x20);
              local_29c0 = CONCAT44(local_22c0._4_4_ + local_22e0._4_4_,
                                    (float)local_22c0 + (float)local_22e0);
              uStack_29b8 = CONCAT44(uStack_22b8._4_4_ + uStack_22d8._4_4_,
                                     (float)uStack_22b8 + (float)uStack_22d8);
              uStack_29b0 = CONCAT44(uStack_22b0._4_4_ + uStack_22d0._4_4_,
                                     (float)uStack_22b0 + (float)uStack_22d0);
              uStack_29a8 = CONCAT44(uStack_22a8._4_4_ + uStack_22c8._4_4_,
                                     (float)uStack_22a8 + (float)uStack_22c8);
              local_2388 = local_2930;
              auVar8._8_8_ = uStack_29b8;
              auVar8._0_8_ = local_29c0;
              auVar8._16_8_ = uStack_29b0;
              auVar8._24_8_ = uStack_29a8;
              *local_2930 = auVar8;
              local_28e0 = local_28e0 + 8;
              local_2930 = local_2930 + 1;
              local_23c0 = local_29c0;
              uStack_23b8 = uStack_29b8;
              uStack_23b0 = uStack_29b0;
              uStack_23a8 = uStack_29a8;
              local_22e0 = local_29a0;
              uStack_22d8 = uStack_2998;
              uStack_22d0 = uStack_2990;
              uStack_22c8 = uStack_2988;
              local_22c0 = uVar12;
              uStack_22b8 = uVar13;
              uStack_22b0 = uVar14;
              uStack_22a8 = uVar15;
            }
            for (; local_1e78 = local_2590, local_1e58 = local_25a0, local_297c < local_2734;
                local_297c = local_297c + 1) {
              *(float *)*local_2930 = *local_28e0 + *(float *)*local_2930;
              local_28e0 = local_28e0 + 1;
              local_2930 = (undefined1 (*) [32])((long)*local_2930 + 4);
            }
          }
        }
        local_2678 = &local_2a10;
        local_20a4 = *(int *)((long)local_2710 + 0x2c);
        local_20a8 = (int)local_2710[6];
        local_20ac = *(undefined4 *)((long)local_2710 + 0x34);
        local_20b8 = (undefined1 (*) [32])
                     (*local_2710 + local_2710[8] * (long)local_28d0 * local_2710[2]);
        local_20c0 = local_2710[2];
        local_20c4 = (undefined4)local_2710[3];
        local_20d0 = local_2710[4];
        local_20a0 = &local_2a10;
        local_1fb8 = (long)local_20a4 * (long)local_20a8 * local_20c0;
        local_2500 = &local_2a10;
        local_2580 = &local_2a10;
        local_2690 = &local_2a60;
        local_2698 = &local_28c8;
        local_2080 = (uint *)((long)local_28c8 + local_2888 * local_28d0 * local_28b8);
        local_2068 = &local_2a60;
        local_1fc8 = (long)local_289c * (long)local_2898 * local_28b8;
        local_2508 = &local_2a60;
        local_2570 = &local_2a60;
        local_29d8 = 0;
        local_29dc = 0;
        local_29e0 = 0;
        local_29e4 = 0;
        local_29f8 = 0;
        local_2a00 = 0;
        local_2a08 = 0;
        local_2a10 = 0;
        local_2a40 = local_28a8;
        local_1fbc = 0x10;
        local_1fcc = 0x10;
        local_206c = local_289c;
        local_2070 = local_2898;
        local_2074 = local_2894;
        local_2088 = local_28b8;
        local_208c = local_28b0;
        local_2098 = local_28a8;
        local_2684 = local_28d0;
        local_2685 = 1;
        local_269c = local_28d0;
        local_269d = 1;
        local_29d0 = 0;
        local_29e8 = 0;
        local_2a60 = 0;
        local_2a50 = 0;
        local_2a48 = 0;
        local_2a38 = 0;
        local_2a34 = 0;
        local_2a30 = 0;
        local_2a2c = 0;
        local_2a28 = 0;
        local_2a20 = 0;
        local_2a58 = 0;
        local_2a64 = 0;
        local_2284 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
        auVar1 = vinsertps_avx(ZEXT416(local_2284),ZEXT416(local_2284),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_2284),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_2284),0x30);
        auVar2 = vinsertps_avx(ZEXT416(local_2284),ZEXT416(local_2284),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(local_2284),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(local_2284),0x30);
        auVar78._16_16_ = auVar1;
        auVar78._0_16_ = auVar2;
        local_1ca0._0_8_ = auVar2._0_8_;
        local_1ca0._8_8_ = auVar2._8_8_;
        local_1ca0._16_8_ = auVar1._0_8_;
        local_1ca0._24_8_ = auVar1._8_8_;
        local_2aa0 = local_1ca0._0_8_;
        uStack_2a98 = local_1ca0._8_8_;
        uStack_2a90 = local_1ca0._16_8_;
        uStack_2a88 = local_1ca0._24_8_;
        local_2288 = local_28cc;
        local_1c24 = local_28cc;
        local_1c28 = local_28cc;
        local_1c2c = local_28cc;
        local_1c30 = local_28cc;
        local_1c34 = local_28cc;
        local_1c38 = local_28cc;
        local_1c3c = local_28cc;
        local_1c40 = local_28cc;
        auVar3 = vinsertps_avx(ZEXT416((uint)local_28cc),ZEXT416((uint)local_28cc),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_28cc),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_28cc),0x30);
        auVar4 = vinsertps_avx(ZEXT416((uint)local_28cc),ZEXT416((uint)local_28cc),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_28cc),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_28cc),0x30);
        auVar79._16_16_ = auVar3;
        auVar79._0_16_ = auVar4;
        local_1c60._0_8_ = auVar4._0_8_;
        local_1c60._8_8_ = auVar4._8_8_;
        local_1c60._16_8_ = auVar3._0_8_;
        local_1c60._24_8_ = auVar3._8_8_;
        local_2ac0 = local_1c60._0_8_;
        uStack_2ab8 = local_1c60._8_8_;
        uStack_2ab0 = local_1c60._16_8_;
        uStack_2aa8 = local_1c60._24_8_;
        local_228c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) ^ 0x80000000;
        auVar5 = vinsertps_avx(ZEXT416(local_228c),ZEXT416(local_228c),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(local_228c),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(local_228c),0x30);
        auVar6 = vinsertps_avx(ZEXT416(local_228c),ZEXT416(local_228c),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(local_228c),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(local_228c),0x30);
        auVar80._16_16_ = auVar5;
        auVar80._0_16_ = auVar6;
        local_1c20._0_8_ = auVar6._0_8_;
        local_1c20._8_8_ = auVar6._8_8_;
        local_1c20._16_8_ = auVar5._0_8_;
        local_1c20._24_8_ = auVar5._8_8_;
        local_2ae0._16_8_ = local_1c20._16_8_;
        local_2ae0._0_16_ = auVar6;
        local_2ae0._24_8_ = local_1c20._24_8_;
        local_2a18 = local_2080;
        local_29c8 = local_20b8;
        for (; local_1eb8 = local_2570, local_1e98 = local_2580, local_1c80 = local_2284,
            local_1c7c = local_2284, local_1c78 = local_2284, local_1c74 = local_2284,
            local_1c70 = local_2284, local_1c6c = local_2284, local_1c68 = local_2284,
            local_1c64 = local_2284, local_1c00 = local_228c, local_1bfc = local_228c,
            local_1bf8 = local_228c, local_1bf4 = local_228c, local_1bf0 = local_228c,
            local_1bec = local_228c, local_1be8 = local_228c, local_1be4 = local_228c,
            local_29f0 = local_20d0, local_2a64 + 7 < local_2734; local_2a64 = local_2a64 + 8) {
          local_24e0 = local_29c8;
          uVar12 = *(undefined8 *)*local_29c8;
          uVar13 = *(undefined8 *)(*local_29c8 + 8);
          uVar14 = *(undefined8 *)(*local_29c8 + 0x10);
          uVar15 = *(undefined8 *)(*local_29c8 + 0x18);
          local_24e8 = local_2a18;
          uVar16 = *(undefined8 *)local_2a18;
          uVar17 = *(undefined8 *)(local_2a18 + 2);
          uVar18 = *(undefined8 *)(local_2a18 + 4);
          uVar19 = *(undefined8 *)(local_2a18 + 6);
          local_2460._0_4_ = (float)uVar16;
          local_2460._4_4_ = (float)((ulong)uVar16 >> 0x20);
          uStack_2458._0_4_ = (float)uVar17;
          uStack_2458._4_4_ = (float)((ulong)uVar17 >> 0x20);
          uStack_2450._0_4_ = (float)uVar18;
          uStack_2450._4_4_ = (float)((ulong)uVar18 >> 0x20);
          uStack_2448._0_4_ = (float)uVar19;
          uStack_2448._4_4_ = (float)((ulong)uVar19 >> 0x20);
          local_2480._0_4_ = auVar4._0_4_;
          local_2480._4_4_ = auVar4._4_4_;
          uStack_2478._0_4_ = auVar4._8_4_;
          uStack_2478._4_4_ = auVar4._12_4_;
          uStack_2470._0_4_ = auVar3._0_4_;
          uStack_2470._4_4_ = auVar3._4_4_;
          uStack_2468._0_4_ = auVar3._8_4_;
          local_2300 = CONCAT44(local_2460._4_4_ * local_2480._4_4_,
                                (float)local_2460 * (float)local_2480);
          uStack_22f8 = CONCAT44(uStack_2458._4_4_ * uStack_2478._4_4_,
                                 (float)uStack_2458 * (float)uStack_2478);
          uStack_22f0 = CONCAT44(uStack_2450._4_4_ * uStack_2470._4_4_,
                                 (float)uStack_2450 * (float)uStack_2470);
          uStack_22e8 = CONCAT44(uStack_2448._4_4_,(float)uStack_2448 * (float)uStack_2468);
          local_2320._0_4_ = auVar2._0_4_;
          local_2320._4_4_ = auVar2._4_4_;
          uStack_2318._0_4_ = auVar2._8_4_;
          uStack_2318._4_4_ = auVar2._12_4_;
          uStack_2310._0_4_ = auVar1._0_4_;
          uStack_2310._4_4_ = auVar1._4_4_;
          uStack_2308._0_4_ = auVar1._8_4_;
          uStack_2308._4_4_ = auVar1._12_4_;
          local_2260 = CONCAT44(local_2460._4_4_ * local_2480._4_4_ + local_2320._4_4_,
                                (float)local_2460 * (float)local_2480 + (float)local_2320);
          uStack_2258 = CONCAT44(uStack_2458._4_4_ * uStack_2478._4_4_ + uStack_2318._4_4_,
                                 (float)uStack_2458 * (float)uStack_2478 + (float)uStack_2318);
          uStack_2250 = CONCAT44(uStack_2450._4_4_ * uStack_2470._4_4_ + uStack_2310._4_4_,
                                 (float)uStack_2450 * (float)uStack_2470 + (float)uStack_2310);
          uStack_2248 = CONCAT44(uStack_2448._4_4_ + uStack_2308._4_4_,
                                 (float)uStack_2448 * (float)uStack_2468 + (float)uStack_2308);
          local_2280 = local_1c20._0_8_;
          uStack_2278 = local_1c20._8_8_;
          uStack_2270 = local_1c20._16_8_;
          uStack_2268 = local_1c20._24_8_;
          uStack_1918 = uStack_2258;
          local_1920 = (undefined1  [8])local_2260;
          uStack_1910 = uStack_2250;
          uStack_1908 = uStack_2248;
          local_1960 = 0x3f8000003f800000;
          uStack_1958 = 0x3f8000003f800000;
          uStack_1950 = 0x3f8000003f800000;
          uStack_1948 = 0x3f8000003f800000;
          local_1780 = ZEXT832(0) << 0x20;
          local_1980 = vcmpps_avx(_local_1920,local_1780,2);
          local_1700 = 0x80000000800000;
          uStack_16f8 = 0x80000000800000;
          uStack_16f0 = 0x80000000800000;
          uStack_16e8 = 0x80000000800000;
          auVar31._16_8_ = uStack_2250;
          auVar31._0_16_ = _local_1920;
          auVar31._24_8_ = uStack_2248;
          auVar30._8_8_ = 0x80000000800000;
          auVar30._0_8_ = 0x80000000800000;
          auVar30._16_8_ = 0x80000000800000;
          auVar30._24_8_ = 0x80000000800000;
          auVar7 = vmaxps_avx(auVar31,auVar30);
          local_1920 = auVar7._0_8_;
          local_280 = local_1920;
          uStack_1918 = auVar7._8_8_;
          uStack_278 = uStack_1918;
          uStack_1910 = auVar7._16_8_;
          uStack_270 = uStack_1910;
          uStack_1908 = auVar7._24_8_;
          uStack_268 = uStack_1908;
          local_2a0 = local_1920;
          uStack_298 = uStack_1918;
          uStack_290 = uStack_1910;
          uStack_288 = uStack_1908;
          local_2a4 = 0x17;
          local_320 = local_1920;
          uStack_318 = uStack_1918;
          uStack_310 = uStack_1910;
          uStack_308 = uStack_1908;
          local_90 = local_1920;
          uStack_88 = uStack_1918;
          local_94 = 0x17;
          local_2c0 = vpsrld_avx(auVar7._0_16_,ZEXT416(0x17));
          local_b0 = uStack_1910;
          uStack_a8 = uStack_1908;
          local_b4 = 0x17;
          local_2d0 = vpsrld_avx(auVar7._16_16_,ZEXT416(0x17));
          local_340 = local_2c0._0_8_;
          uStack_338 = local_2c0._8_8_;
          uStack_330 = local_2d0._0_8_;
          uStack_328 = local_2d0._8_8_;
          local_300 = local_2c0._0_8_;
          uStack_2f8 = local_2c0._8_8_;
          uStack_2f0 = local_2d0._0_8_;
          uStack_2e8 = local_2d0._8_8_;
          local_f80 = local_1920;
          uStack_f78 = uStack_1918;
          uStack_f70 = uStack_1910;
          uStack_f68 = uStack_1908;
          local_fa0 = 0x807fffff807fffff;
          uStack_f98 = 0x807fffff807fffff;
          uStack_f90 = 0x807fffff807fffff;
          uStack_f88 = 0x807fffff807fffff;
          auVar34._8_8_ = 0x807fffff807fffff;
          auVar34._0_8_ = 0x807fffff807fffff;
          auVar34._16_8_ = 0x807fffff807fffff;
          auVar34._24_8_ = 0x807fffff807fffff;
          auVar7 = vandps_avx(auVar7,auVar34);
          local_1920 = auVar7._0_8_;
          local_200 = local_1920;
          uStack_1918 = auVar7._8_8_;
          uStack_1f8 = uStack_1918;
          uStack_1910 = auVar7._16_8_;
          uStack_1f0 = uStack_1910;
          uStack_1908 = auVar7._24_8_;
          uStack_1e8 = uStack_1908;
          local_220 = 0x3f0000003f000000;
          uStack_218 = 0x3f0000003f000000;
          uStack_210 = 0x3f0000003f000000;
          uStack_208 = 0x3f0000003f000000;
          auVar72._8_8_ = 0x3f0000003f000000;
          auVar72._0_8_ = 0x3f0000003f000000;
          auVar72._16_8_ = 0x3f0000003f000000;
          auVar72._24_8_ = 0x3f0000003f000000;
          auVar8 = vorps_avx(auVar7,auVar72);
          local_100 = local_2c0._0_8_;
          uStack_f8 = local_2c0._8_8_;
          uStack_f0 = local_2d0._0_8_;
          uStack_e8 = local_2d0._8_8_;
          local_120 = 0x7f0000007f;
          uStack_118 = 0x7f0000007f;
          uStack_110 = 0x7f0000007f;
          uStack_108 = 0x7f0000007f;
          local_1a0 = local_2c0._0_8_;
          uStack_198 = local_2c0._8_8_;
          uStack_190 = local_2d0._0_8_;
          uStack_188 = local_2d0._8_8_;
          local_1c0 = 0x7f0000007f;
          uStack_1b8 = 0x7f0000007f;
          uStack_1b0 = 0x7f0000007f;
          uStack_1a8 = 0x7f0000007f;
          local_150 = 0x7f0000007f;
          uStack_148 = 0x7f0000007f;
          local_160 = 0x7f0000007f;
          uStack_158 = 0x7f0000007f;
          local_50 = local_2c0._0_8_;
          uStack_48 = local_2c0._8_8_;
          local_60 = 0x7f0000007f;
          uStack_58 = 0x7f0000007f;
          auVar75._8_8_ = 0x7f0000007f;
          auVar75._0_8_ = 0x7f0000007f;
          local_130 = vpsubd_avx(local_2c0,auVar75);
          local_70 = local_2d0._0_8_;
          uStack_68 = local_2d0._8_8_;
          local_80 = 0x7f0000007f;
          uStack_78 = 0x7f0000007f;
          auVar74._8_8_ = 0x7f0000007f;
          auVar74._0_8_ = 0x7f0000007f;
          local_140 = vpsubd_avx(local_2d0,auVar74);
          local_1e0 = local_130._0_8_;
          uStack_1d8 = local_130._8_8_;
          uStack_1d0 = local_140._0_8_;
          uStack_1c8 = local_140._8_8_;
          local_180 = local_130._0_8_;
          uStack_178 = local_130._8_8_;
          uStack_170 = local_140._0_8_;
          uStack_168 = local_140._8_8_;
          local_1940 = local_130._0_8_;
          uStack_1938 = local_130._8_8_;
          uStack_1930 = local_140._0_8_;
          uStack_1928 = local_140._8_8_;
          local_e0 = local_130._0_8_;
          uStack_d8 = local_130._8_8_;
          uStack_d0 = local_140._0_8_;
          uStack_c8 = local_140._8_8_;
          auVar73._16_8_ = local_140._0_8_;
          auVar73._0_16_ = local_130;
          auVar73._24_8_ = local_140._8_8_;
          auVar7 = vcvtdq2ps_avx(auVar73);
          local_19a0 = auVar7._0_8_;
          uVar20 = local_19a0;
          uStack_1998 = auVar7._8_8_;
          uVar21 = uStack_1998;
          uStack_1990 = auVar7._16_8_;
          uVar22 = uStack_1990;
          uStack_1988 = auVar7._24_8_;
          uVar23 = uStack_1988;
          local_17c0 = 0x3f8000003f800000;
          uStack_17b8 = 0x3f8000003f800000;
          uStack_17b0 = 0x3f8000003f800000;
          uStack_17a8 = 0x3f8000003f800000;
          local_17a0._0_4_ = auVar7._0_4_;
          local_17a0._4_4_ = auVar7._4_4_;
          uStack_1798._0_4_ = auVar7._8_4_;
          uStack_1798._4_4_ = auVar7._12_4_;
          uStack_1790._0_4_ = auVar7._16_4_;
          uStack_1790._4_4_ = auVar7._20_4_;
          uStack_1788._0_4_ = auVar7._24_4_;
          uStack_1788._4_4_ = auVar7._28_4_;
          local_19a0._4_4_ = local_17a0._4_4_ + 1.0;
          local_19a0._0_4_ = (float)local_17a0 + 1.0;
          uStack_1998._0_4_ = (float)uStack_1798 + 1.0;
          uStack_1998._4_4_ = uStack_1798._4_4_ + 1.0;
          uStack_1990._0_4_ = (float)uStack_1790 + 1.0;
          uStack_1990._4_4_ = uStack_1790._4_4_ + 1.0;
          auVar76 = _local_19a0;
          uStack_1988._0_4_ = (float)uStack_1788 + 1.0;
          uStack_1988._4_4_ = uStack_1788._4_4_ + 1.0;
          auVar9 = _local_19a0;
          local_19c0 = vcmpps_avx(auVar8,_DAT_01ed46a0,1);
          local_1920 = auVar8._0_8_;
          local_fc0 = local_1920;
          uStack_1918 = auVar8._8_8_;
          uStack_fb8 = uStack_1918;
          uStack_1910 = auVar8._16_8_;
          uStack_fb0 = uStack_1910;
          uStack_1908 = auVar8._24_8_;
          uStack_fa8 = uStack_1908;
          local_fe0 = local_19c0._0_8_;
          uStack_fd8 = local_19c0._8_8_;
          uStack_fd0 = local_19c0._16_8_;
          uStack_fc8 = local_19c0._24_8_;
          local_19e0 = vandps_avx(auVar8,local_19c0);
          local_ec0 = local_1920;
          uStack_eb8 = uStack_1918;
          uStack_eb0 = uStack_1910;
          uStack_ea8 = uStack_1908;
          local_ee0 = 0x3f8000003f800000;
          uStack_ed8 = 0x3f8000003f800000;
          uStack_ed0 = 0x3f8000003f800000;
          uStack_ec8 = 0x3f8000003f800000;
          auVar37._8_8_ = 0x3f8000003f800000;
          auVar37._0_8_ = 0x3f8000003f800000;
          auVar37._16_8_ = 0x3f8000003f800000;
          auVar37._24_8_ = 0x3f8000003f800000;
          auVar7 = vsubps_avx(auVar8,auVar37);
          local_f00 = local_19a0;
          uStack_ef8 = uStack_1998;
          uStack_1990 = auVar76._16_8_;
          uStack_ef0 = uStack_1990;
          uStack_1988 = auVar9._24_8_;
          uStack_ee8 = uStack_1988;
          local_1000 = 0x3f8000003f800000;
          uStack_ff8 = 0x3f8000003f800000;
          uStack_ff0 = 0x3f8000003f800000;
          uStack_fe8 = 0x3f8000003f800000;
          local_1020 = local_19c0._0_8_;
          uStack_1018 = local_19c0._8_8_;
          uStack_1010 = local_19c0._16_8_;
          uStack_1008 = local_19c0._24_8_;
          auVar33._8_8_ = 0x3f8000003f800000;
          auVar33._0_8_ = 0x3f8000003f800000;
          auVar33._16_8_ = 0x3f8000003f800000;
          auVar33._24_8_ = 0x3f8000003f800000;
          local_f20 = vandps_avx(auVar33,local_19c0);
          auVar36._16_8_ = uStack_1990;
          auVar36._0_16_ = _local_19a0;
          auVar36._24_8_ = uStack_1988;
          _local_19a0 = vsubps_avx(auVar36,local_f20);
          local_1920 = auVar7._0_8_;
          uVar24 = local_1920;
          uStack_1918 = auVar7._8_8_;
          uVar25 = uStack_1918;
          uStack_1910 = auVar7._16_8_;
          uVar26 = uStack_1910;
          uStack_1908 = auVar7._24_8_;
          uVar27 = uStack_1908;
          local_17e0._0_4_ = auVar7._0_4_;
          local_17e0._4_4_ = auVar7._4_4_;
          uStack_17d8._0_4_ = auVar7._8_4_;
          uStack_17d8._4_4_ = auVar7._12_4_;
          uStack_17d0._0_4_ = auVar7._16_4_;
          uStack_17d0._4_4_ = auVar7._20_4_;
          uStack_17c8._0_4_ = auVar7._24_4_;
          uStack_17c8._4_4_ = auVar7._28_4_;
          local_1800._0_4_ = local_19e0._0_4_;
          local_1800._4_4_ = local_19e0._4_4_;
          uStack_17f8._0_4_ = local_19e0._8_4_;
          uStack_17f8._4_4_ = local_19e0._12_4_;
          uStack_17f0._0_4_ = local_19e0._16_4_;
          uStack_17f0._4_4_ = local_19e0._20_4_;
          uStack_17e8._0_4_ = local_19e0._24_4_;
          uStack_17e8._4_4_ = local_19e0._28_4_;
          local_1920._0_4_ = (float)local_17e0 + (float)local_1800;
          local_1920._4_4_ = local_17e0._4_4_ + local_1800._4_4_;
          uStack_17d8._0_4_ = (float)uStack_17d8 + (float)uStack_17f8;
          uStack_17d8._4_4_ = uStack_17d8._4_4_ + uStack_17f8._4_4_;
          uStack_17d0._0_4_ = (float)uStack_17d0 + (float)uStack_17f0;
          uStack_17d0._4_4_ = uStack_17d0._4_4_ + uStack_17f0._4_4_;
          uStack_17c8._0_4_ = (float)uStack_17c8 + (float)uStack_17e8;
          fStack_19e4 = uStack_17c8._4_4_ + uStack_17e8._4_4_;
          uStack_1918._0_4_ = (float)uStack_17d8;
          uStack_1918._4_4_ = uStack_17d8._4_4_;
          uStack_1910._0_4_ = (float)uStack_17d0;
          uStack_1910._4_4_ = uStack_17d0._4_4_;
          auVar76 = _local_1920;
          uStack_1908._0_4_ = (float)uStack_17c8;
          uStack_1908._4_4_ = fStack_19e4;
          auVar7 = _local_1920;
          local_1880 = local_1920;
          uStack_1878 = uStack_1918;
          uStack_1910 = auVar76._16_8_;
          uStack_1870 = uStack_1910;
          uStack_1908 = auVar7._24_8_;
          uStack_1868 = uStack_1908;
          local_1a00 = (float)local_1920._0_4_ * (float)local_1920._0_4_;
          fStack_19fc = (float)local_1920._4_4_ * (float)local_1920._4_4_;
          fStack_19f8 = (float)uStack_17d8 * (float)uStack_17d8;
          fStack_19f4 = uStack_17d8._4_4_ * uStack_17d8._4_4_;
          fStack_19f0 = (float)uStack_17d0 * (float)uStack_17d0;
          fStack_19ec = uStack_17d0._4_4_ * uStack_17d0._4_4_;
          fStack_19e8 = (float)uStack_17c8 * (float)uStack_17c8;
          uStack_1a18 = 0x3d9021bb3d9021bb;
          local_1a20 = (undefined1  [8])0x3d9021bb3d9021bb;
          local_12e0 = 0x3d9021bb3d9021bb;
          uStack_12d8 = 0x3d9021bb3d9021bb;
          uStack_12d0 = 0x3d9021bb3d9021bb;
          uStack_12c8 = 0x3d9021bb3d9021bb;
          local_1300 = local_1920;
          uStack_12f8 = uStack_1918;
          uStack_12f0 = uStack_1910;
          uStack_12e8 = uStack_1908;
          local_1320 = 0xbdebd1b8bdebd1b8;
          uStack_1318 = 0xbdebd1b8bdebd1b8;
          uStack_1310 = 0xbdebd1b8bdebd1b8;
          uStack_1308 = 0xbdebd1b8bdebd1b8;
          local_860 = 0x3d9021bb3d9021bb;
          uStack_858 = 0x3d9021bb3d9021bb;
          uStack_850 = 0x3d9021bb3d9021bb;
          uStack_848 = 0x3d9021bb3d9021bb;
          local_880 = local_1920;
          uStack_878 = uStack_1918;
          uStack_870 = uStack_1910;
          uStack_868 = uStack_1908;
          local_8a0 = 0xbdebd1b8bdebd1b8;
          uStack_898 = 0xbdebd1b8bdebd1b8;
          uStack_890 = 0xbdebd1b8bdebd1b8;
          uStack_888 = 0xbdebd1b8bdebd1b8;
          auVar48._16_8_ = 0x3d9021bb3d9021bb;
          auVar48._0_16_ = _local_1a20;
          auVar48._24_8_ = 0x3d9021bb3d9021bb;
          auVar47._16_8_ = uStack_1910;
          auVar47._0_16_ = _local_1920;
          auVar47._24_8_ = uStack_1908;
          auVar46._8_8_ = 0xbdebd1b8bdebd1b8;
          auVar46._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar46._16_8_ = 0xbdebd1b8bdebd1b8;
          auVar46._24_8_ = 0xbdebd1b8bdebd1b8;
          auVar10 = vfmadd213ps_fma(auVar47,auVar48,auVar46);
          local_3080 = auVar10._0_8_;
          uStack_3078 = auVar10._8_8_;
          local_1340 = local_3080;
          uStack_1338 = uStack_3078;
          uStack_1330 = 0;
          uStack_1328 = 0;
          local_1360 = local_1920;
          uStack_1358 = uStack_1918;
          uStack_1350 = uStack_1910;
          uStack_1348 = uStack_1908;
          local_1380 = 0x3def251a3def251a;
          uStack_1378 = 0x3def251a3def251a;
          uStack_1370 = 0x3def251a3def251a;
          uStack_1368 = 0x3def251a3def251a;
          local_800 = local_3080;
          uStack_7f8 = uStack_3078;
          uStack_7f0 = 0;
          uStack_7e8 = 0;
          local_820 = local_1920;
          uStack_818 = uStack_1918;
          uStack_810 = uStack_1910;
          uStack_808 = uStack_1908;
          local_840 = 0x3def251a3def251a;
          uStack_838 = 0x3def251a3def251a;
          uStack_830 = 0x3def251a3def251a;
          uStack_828 = 0x3def251a3def251a;
          auVar50._16_8_ = uStack_1910;
          auVar50._0_16_ = _local_1920;
          auVar50._24_8_ = uStack_1908;
          auVar49._8_8_ = 0x3def251a3def251a;
          auVar49._0_8_ = 0x3def251a3def251a;
          auVar49._16_8_ = 0x3def251a3def251a;
          auVar49._24_8_ = 0x3def251a3def251a;
          auVar10 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar10),auVar49);
          local_30a0 = auVar10._0_8_;
          uStack_3098 = auVar10._8_8_;
          local_13a0 = local_30a0;
          uStack_1398 = uStack_3098;
          uStack_1390 = 0;
          uStack_1388 = 0;
          local_13c0 = local_1920;
          uStack_13b8 = uStack_1918;
          uStack_13b0 = uStack_1910;
          uStack_13a8 = uStack_1908;
          local_13e0 = 0xbdfe5d4fbdfe5d4f;
          uStack_13d8 = 0xbdfe5d4fbdfe5d4f;
          uStack_13d0 = 0xbdfe5d4fbdfe5d4f;
          uStack_13c8 = 0xbdfe5d4fbdfe5d4f;
          local_7a0 = local_30a0;
          uStack_798 = uStack_3098;
          uStack_790 = 0;
          uStack_788 = 0;
          local_7c0 = local_1920;
          uStack_7b8 = uStack_1918;
          uStack_7b0 = uStack_1910;
          uStack_7a8 = uStack_1908;
          local_7e0 = 0xbdfe5d4fbdfe5d4f;
          uStack_7d8 = 0xbdfe5d4fbdfe5d4f;
          uStack_7d0 = 0xbdfe5d4fbdfe5d4f;
          uStack_7c8 = 0xbdfe5d4fbdfe5d4f;
          auVar52._16_8_ = uStack_1910;
          auVar52._0_16_ = _local_1920;
          auVar52._24_8_ = uStack_1908;
          auVar51._8_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar51._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar51._16_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar51._24_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar10 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar10),auVar51);
          local_30c0 = auVar10._0_8_;
          uStack_30b8 = auVar10._8_8_;
          local_1400 = local_30c0;
          uStack_13f8 = uStack_30b8;
          uStack_13f0 = 0;
          uStack_13e8 = 0;
          local_1420 = local_1920;
          uStack_1418 = uStack_1918;
          uStack_1410 = uStack_1910;
          uStack_1408 = uStack_1908;
          local_1440 = 0x3e11e9bf3e11e9bf;
          uStack_1438 = 0x3e11e9bf3e11e9bf;
          uStack_1430 = 0x3e11e9bf3e11e9bf;
          uStack_1428 = 0x3e11e9bf3e11e9bf;
          local_740 = local_30c0;
          uStack_738 = uStack_30b8;
          uStack_730 = 0;
          uStack_728 = 0;
          local_760 = local_1920;
          uStack_758 = uStack_1918;
          uStack_750 = uStack_1910;
          uStack_748 = uStack_1908;
          local_780 = 0x3e11e9bf3e11e9bf;
          uStack_778 = 0x3e11e9bf3e11e9bf;
          uStack_770 = 0x3e11e9bf3e11e9bf;
          uStack_768 = 0x3e11e9bf3e11e9bf;
          auVar54._16_8_ = uStack_1910;
          auVar54._0_16_ = _local_1920;
          auVar54._24_8_ = uStack_1908;
          auVar53._8_8_ = 0x3e11e9bf3e11e9bf;
          auVar53._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar53._16_8_ = 0x3e11e9bf3e11e9bf;
          auVar53._24_8_ = 0x3e11e9bf3e11e9bf;
          auVar10 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar10),auVar53);
          local_30e0 = auVar10._0_8_;
          uStack_30d8 = auVar10._8_8_;
          local_1460 = local_30e0;
          uStack_1458 = uStack_30d8;
          uStack_1450 = 0;
          uStack_1448 = 0;
          local_1480 = local_1920;
          uStack_1478 = uStack_1918;
          uStack_1470 = uStack_1910;
          uStack_1468 = uStack_1908;
          local_14a0 = 0xbe2aae50be2aae50;
          uStack_1498 = 0xbe2aae50be2aae50;
          uStack_1490 = 0xbe2aae50be2aae50;
          uStack_1488 = 0xbe2aae50be2aae50;
          local_6e0 = local_30e0;
          uStack_6d8 = uStack_30d8;
          uStack_6d0 = 0;
          uStack_6c8 = 0;
          local_700 = local_1920;
          uStack_6f8 = uStack_1918;
          uStack_6f0 = uStack_1910;
          uStack_6e8 = uStack_1908;
          local_720 = 0xbe2aae50be2aae50;
          uStack_718 = 0xbe2aae50be2aae50;
          uStack_710 = 0xbe2aae50be2aae50;
          uStack_708 = 0xbe2aae50be2aae50;
          auVar56._16_8_ = uStack_1910;
          auVar56._0_16_ = _local_1920;
          auVar56._24_8_ = uStack_1908;
          auVar55._8_8_ = 0xbe2aae50be2aae50;
          auVar55._0_8_ = 0xbe2aae50be2aae50;
          auVar55._16_8_ = 0xbe2aae50be2aae50;
          auVar55._24_8_ = 0xbe2aae50be2aae50;
          auVar10 = vfmadd213ps_fma(auVar56,ZEXT1632(auVar10),auVar55);
          local_3100 = auVar10._0_8_;
          uStack_30f8 = auVar10._8_8_;
          local_14c0 = local_3100;
          uStack_14b8 = uStack_30f8;
          uStack_14b0 = 0;
          uStack_14a8 = 0;
          local_14e0 = local_1920;
          uStack_14d8 = uStack_1918;
          uStack_14d0 = uStack_1910;
          uStack_14c8 = uStack_1908;
          local_1500 = 0x3e4cceac3e4cceac;
          uStack_14f8 = 0x3e4cceac3e4cceac;
          uStack_14f0 = 0x3e4cceac3e4cceac;
          uStack_14e8 = 0x3e4cceac3e4cceac;
          local_680 = local_3100;
          uStack_678 = uStack_30f8;
          uStack_670 = 0;
          uStack_668 = 0;
          local_6a0 = local_1920;
          uStack_698 = uStack_1918;
          uStack_690 = uStack_1910;
          uStack_688 = uStack_1908;
          local_6c0 = 0x3e4cceac3e4cceac;
          uStack_6b8 = 0x3e4cceac3e4cceac;
          uStack_6b0 = 0x3e4cceac3e4cceac;
          uStack_6a8 = 0x3e4cceac3e4cceac;
          auVar58._16_8_ = uStack_1910;
          auVar58._0_16_ = _local_1920;
          auVar58._24_8_ = uStack_1908;
          auVar57._8_8_ = 0x3e4cceac3e4cceac;
          auVar57._0_8_ = 0x3e4cceac3e4cceac;
          auVar57._16_8_ = 0x3e4cceac3e4cceac;
          auVar57._24_8_ = 0x3e4cceac3e4cceac;
          auVar10 = vfmadd213ps_fma(auVar58,ZEXT1632(auVar10),auVar57);
          local_3120 = auVar10._0_8_;
          uStack_3118 = auVar10._8_8_;
          local_1520 = local_3120;
          uStack_1518 = uStack_3118;
          uStack_1510 = 0;
          uStack_1508 = 0;
          local_1540 = local_1920;
          uStack_1538 = uStack_1918;
          uStack_1530 = uStack_1910;
          uStack_1528 = uStack_1908;
          local_1560 = 0xbe7ffffcbe7ffffc;
          uStack_1558 = 0xbe7ffffcbe7ffffc;
          uStack_1550 = 0xbe7ffffcbe7ffffc;
          uStack_1548 = 0xbe7ffffcbe7ffffc;
          local_620 = local_3120;
          uStack_618 = uStack_3118;
          uStack_610 = 0;
          uStack_608 = 0;
          local_640 = local_1920;
          uStack_638 = uStack_1918;
          uStack_630 = uStack_1910;
          uStack_628 = uStack_1908;
          local_660 = 0xbe7ffffcbe7ffffc;
          uStack_658 = 0xbe7ffffcbe7ffffc;
          uStack_650 = 0xbe7ffffcbe7ffffc;
          uStack_648 = 0xbe7ffffcbe7ffffc;
          auVar60._16_8_ = uStack_1910;
          auVar60._0_16_ = _local_1920;
          auVar60._24_8_ = uStack_1908;
          auVar59._8_8_ = 0xbe7ffffcbe7ffffc;
          auVar59._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar59._16_8_ = 0xbe7ffffcbe7ffffc;
          auVar59._24_8_ = 0xbe7ffffcbe7ffffc;
          auVar10 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar10),auVar59);
          local_3140 = auVar10._0_8_;
          uStack_3138 = auVar10._8_8_;
          local_1580 = local_3140;
          uStack_1578 = uStack_3138;
          uStack_1570 = 0;
          uStack_1568 = 0;
          local_15a0 = local_1920;
          uStack_1598 = uStack_1918;
          uStack_1590 = uStack_1910;
          uStack_1588 = uStack_1908;
          local_15c0 = 0x3eaaaaaa3eaaaaaa;
          uStack_15b8 = 0x3eaaaaaa3eaaaaaa;
          uStack_15b0 = 0x3eaaaaaa3eaaaaaa;
          uStack_15a8 = 0x3eaaaaaa3eaaaaaa;
          local_5c0 = local_3140;
          uStack_5b8 = uStack_3138;
          uStack_5b0 = 0;
          uStack_5a8 = 0;
          local_5e0 = local_1920;
          uStack_5d8 = uStack_1918;
          uStack_5d0 = uStack_1910;
          uStack_5c8 = uStack_1908;
          local_600 = 0x3eaaaaaa3eaaaaaa;
          uStack_5f8 = 0x3eaaaaaa3eaaaaaa;
          uStack_5f0 = 0x3eaaaaaa3eaaaaaa;
          uStack_5e8 = 0x3eaaaaaa3eaaaaaa;
          auVar62._16_8_ = uStack_1910;
          auVar62._0_16_ = _local_1920;
          auVar62._24_8_ = uStack_1908;
          auVar61._8_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar61._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar61._16_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar61._24_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar10 = vfmadd213ps_fma(auVar62,ZEXT1632(auVar10),auVar61);
          local_3160 = auVar10._0_8_;
          uStack_3158 = auVar10._8_8_;
          uStack_1890 = 0;
          uStack_1888 = 0;
          local_18c0 = local_1920;
          uStack_18b8 = uStack_1918;
          uStack_18b0 = uStack_1910;
          uStack_18a8 = uStack_1908;
          local_18a0._0_4_ = auVar10._0_4_;
          local_18a0._4_4_ = auVar10._4_4_;
          uStack_1898._0_4_ = auVar10._8_4_;
          uStack_1898._4_4_ = auVar10._12_4_;
          local_1a20._4_4_ = local_18a0._4_4_ * (float)local_1920._4_4_;
          local_1a20._0_4_ = (float)local_18a0 * (float)local_1920._0_4_;
          uStack_1a18._0_4_ = (float)uStack_1898 * (float)uStack_17d8;
          uStack_1a18._4_4_ = uStack_1898._4_4_ * uStack_17d8._4_4_;
          uStack_1a10._0_4_ = (float)uStack_17d0 * 0.0;
          uStack_1a10._4_4_ = uStack_17d0._4_4_ * 0.0;
          auVar76 = _local_1a20;
          local_18e0 = local_1a20;
          uStack_18d8 = uStack_1a18;
          uStack_1a10 = auVar76._16_8_;
          uStack_18d0 = uStack_1a10;
          uStack_1a08 = (ulong)(uint)((float)uStack_17c8 * 0.0);
          uStack_18c8 = uStack_1a08;
          local_1900 = CONCAT44(fStack_19fc,local_1a00);
          uStack_18f8 = CONCAT44(fStack_19f4,fStack_19f8);
          uStack_18f0 = CONCAT44(fStack_19ec,fStack_19f0);
          uStack_18e8 = CONCAT44(fStack_19e4,fStack_19e8);
          fVar81 = (float)uStack_17c8 * 0.0 * fStack_19e8;
          local_1a20._4_4_ = local_18a0._4_4_ * (float)local_1920._4_4_ * fStack_19fc;
          local_1a20._0_4_ = (float)local_18a0 * (float)local_1920._0_4_ * local_1a00;
          uStack_1a18._0_4_ = (float)uStack_1898 * (float)uStack_17d8 * fStack_19f8;
          uStack_1a18._4_4_ = uStack_1898._4_4_ * uStack_17d8._4_4_ * fStack_19f4;
          uStack_1a10._0_4_ = (float)uStack_17d0 * 0.0 * fStack_19f0;
          uStack_1a10._4_4_ = uStack_17d0._4_4_ * 0.0 * fStack_19ec;
          auVar76 = _local_1a20;
          local_15e0 = local_19a0;
          uStack_15d8 = uStack_1998;
          uStack_15d0 = uStack_1990;
          uStack_15c8 = uStack_1988;
          local_1620 = local_1a20;
          uStack_1618 = uStack_1a18;
          uStack_1a10 = auVar76._16_8_;
          uStack_1610 = uStack_1a10;
          uStack_1a08 = (ulong)(uint)fVar81;
          uStack_1608 = uStack_1a08;
          local_1600 = 0xb95e8083b95e8083;
          uStack_15f8 = 0xb95e8083b95e8083;
          uStack_15f0 = 0xb95e8083b95e8083;
          uStack_15e8 = 0xb95e8083b95e8083;
          local_560 = local_19a0;
          uStack_558 = uStack_1998;
          uStack_550 = uStack_1990;
          uStack_548 = uStack_1988;
          local_580 = 0xb95e8083b95e8083;
          uStack_578 = 0xb95e8083b95e8083;
          uStack_570 = 0xb95e8083b95e8083;
          uStack_568 = 0xb95e8083b95e8083;
          local_5a0 = local_1a20;
          uStack_598 = uStack_1a18;
          uStack_590 = uStack_1a10;
          uStack_588 = uStack_1a08;
          auVar64._8_8_ = 0xb95e8083b95e8083;
          auVar64._0_8_ = 0xb95e8083b95e8083;
          auVar64._16_8_ = 0xb95e8083b95e8083;
          auVar64._24_8_ = 0xb95e8083b95e8083;
          auVar63._16_8_ = uStack_1a10;
          auVar63._0_16_ = _local_1a20;
          auVar63._24_4_ = fVar81;
          auVar63._28_4_ = 0;
          auVar10 = vfmadd213ps_fma(auVar64,_local_19a0,auVar63);
          local_3180 = auVar10._0_8_;
          uStack_3178 = auVar10._8_8_;
          local_e20 = CONCAT44(fStack_19fc,local_1a00);
          uStack_e18 = CONCAT44(fStack_19f4,fStack_19f8);
          uStack_e10 = CONCAT44(fStack_19ec,fStack_19f0);
          uStack_e08 = CONCAT44(fStack_19e4,fStack_19e8);
          local_e60 = local_3180;
          uStack_e58 = uStack_3178;
          uStack_e50 = 0;
          uStack_e48 = 0;
          local_e40 = 0x3f0000003f000000;
          uStack_e38 = 0x3f0000003f000000;
          uStack_e30 = 0x3f0000003f000000;
          uStack_e28 = 0x3f0000003f000000;
          local_400 = 0x3f0000003f000000;
          uStack_3f8 = 0x3f0000003f000000;
          uStack_3f0 = 0x3f0000003f000000;
          uStack_3e8 = 0x3f0000003f000000;
          local_420 = local_3180;
          uStack_418 = uStack_3178;
          uStack_410 = 0;
          uStack_408 = 0;
          auVar82._0_8_ = CONCAT44(fStack_19fc,local_1a00) ^ 0x8000000080000000;
          auVar82._8_4_ = -fStack_19f8;
          auVar82._12_4_ = -fStack_19f4;
          auVar82._16_4_ = -fStack_19f0;
          auVar82._20_4_ = -fStack_19ec;
          auVar82._24_4_ = -fStack_19e8;
          auVar82._28_4_ = -fStack_19e4;
          auVar69._8_8_ = 0x3f0000003f000000;
          auVar69._0_8_ = 0x3f0000003f000000;
          auVar69._16_8_ = 0x3f0000003f000000;
          auVar69._24_8_ = 0x3f0000003f000000;
          auVar10 = vfmadd213ps_fma(auVar69,auVar82,ZEXT1632(auVar10));
          local_31a0 = auVar10._0_8_;
          uStack_3198 = auVar10._8_8_;
          local_1820 = local_1920;
          uStack_1818 = uStack_1918;
          uStack_1810 = uStack_1910;
          uStack_1808 = uStack_1908;
          uStack_1830 = 0;
          uStack_1828 = 0;
          local_1840._0_4_ = auVar10._0_4_;
          local_1840._4_4_ = auVar10._4_4_;
          uStack_1838._0_4_ = auVar10._8_4_;
          uStack_1838._4_4_ = auVar10._12_4_;
          local_1920._4_4_ = (float)local_1920._4_4_ + local_1840._4_4_;
          local_1920._0_4_ = (float)local_1920._0_4_ + (float)local_1840;
          uStack_1918._0_4_ = (float)uStack_17d8 + (float)uStack_1838;
          uStack_1918._4_4_ = uStack_17d8._4_4_ + uStack_1838._4_4_;
          uStack_1910._0_4_ = (float)uStack_17d0 + 0.0;
          uStack_1910._4_4_ = uStack_17d0._4_4_ + 0.0;
          auVar76 = _local_1920;
          uStack_1908._0_4_ = (float)uStack_17c8 + 0.0;
          uStack_1908._4_4_ = fStack_19e4 + 0.0;
          auVar7 = _local_1920;
          local_1640 = local_19a0;
          uStack_1638 = uStack_1998;
          uStack_1630 = uStack_1990;
          uStack_1628 = uStack_1988;
          local_1680 = local_1920;
          uStack_1678 = uStack_1918;
          uStack_1910 = auVar76._16_8_;
          uStack_1670 = uStack_1910;
          uStack_1908 = auVar7._24_8_;
          uStack_1668 = uStack_1908;
          local_1660 = 0x3f3180003f318000;
          uStack_1658 = 0x3f3180003f318000;
          uStack_1650 = 0x3f3180003f318000;
          uStack_1648 = 0x3f3180003f318000;
          local_500 = local_19a0;
          uStack_4f8 = uStack_1998;
          uStack_4f0 = uStack_1990;
          uStack_4e8 = uStack_1988;
          local_520 = 0x3f3180003f318000;
          uStack_518 = 0x3f3180003f318000;
          uStack_510 = 0x3f3180003f318000;
          uStack_508 = 0x3f3180003f318000;
          local_540 = local_1920;
          uStack_538 = uStack_1918;
          uStack_530 = uStack_1910;
          uStack_528 = uStack_1908;
          auVar66._8_8_ = 0x3f3180003f318000;
          auVar66._0_8_ = 0x3f3180003f318000;
          auVar66._16_8_ = 0x3f3180003f318000;
          auVar66._24_8_ = 0x3f3180003f318000;
          auVar65._16_8_ = uStack_1910;
          auVar65._0_16_ = _local_1920;
          auVar65._24_8_ = uStack_1908;
          auVar10 = vfmadd213ps_fma(auVar66,_local_19a0,auVar65);
          local_31c0 = auVar10._0_8_;
          uStack_31b8 = auVar10._8_8_;
          _local_1920 = ZEXT1632(auVar10);
          local_240 = local_31c0;
          uStack_238 = uStack_31b8;
          uStack_230 = 0;
          uStack_228 = 0;
          local_260 = local_1980._0_8_;
          uStack_258 = local_1980._8_8_;
          uStack_250 = local_1980._16_8_;
          uStack_248 = local_1980._24_8_;
          _local_1a20 = vorps_avx(ZEXT1632(auVar10),local_1980);
          local_2220._0_4_ = auVar6._0_4_;
          local_2220._4_4_ = auVar6._4_4_;
          uStack_2218._0_4_ = auVar6._8_4_;
          uStack_2218._4_4_ = auVar6._12_4_;
          uStack_2210._0_4_ = auVar5._0_4_;
          uStack_2210._4_4_ = auVar5._4_4_;
          uStack_2208._0_4_ = auVar5._8_4_;
          uStack_2208._4_4_ = auVar5._12_4_;
          local_2240._0_4_ = local_1a20._0_4_;
          local_2240._4_4_ = local_1a20._4_4_;
          uStack_2238._0_4_ = local_1a20._8_4_;
          uStack_2238._4_4_ = local_1a20._12_4_;
          uStack_2230._0_4_ = local_1a20._16_4_;
          uStack_2230._4_4_ = local_1a20._20_4_;
          uStack_2228._0_4_ = local_1a20._24_4_;
          local_1b00._4_4_ = local_2220._4_4_ * local_2240._4_4_;
          local_1b00._0_4_ = (float)local_2220 * (float)local_2240;
          uStack_1af8._0_4_ = (float)uStack_2218 * (float)uStack_2238;
          uStack_1af8._4_4_ = uStack_2218._4_4_ * uStack_2238._4_4_;
          uStack_1af0._0_4_ = (float)uStack_2210 * (float)uStack_2230;
          uStack_1af0._4_4_ = uStack_2210._4_4_ * uStack_2230._4_4_;
          auVar76 = _local_1b00;
          uStack_1ae8._0_4_ = (float)uStack_2208 * (float)uStack_2228;
          uStack_1ae8._4_4_ = uStack_2208._4_4_;
          auVar7 = _local_1b00;
          local_1760 = ZEXT432(0) << 0x20;
          local_1b80 = 0x3f8000003f800000;
          uStack_1b78 = 0x3f8000003f800000;
          uStack_1b70 = 0x3f8000003f800000;
          uStack_1b68 = 0x3f8000003f800000;
          local_1720 = local_1b00;
          uStack_1718 = uStack_1af8;
          uStack_1af0 = auVar76._16_8_;
          uStack_1710 = uStack_1af0;
          uStack_1ae8 = auVar7._24_8_;
          uStack_1708 = uStack_1ae8;
          local_1740 = 0x42b0c0a542b0c0a5;
          uStack_1738 = 0x42b0c0a542b0c0a5;
          uStack_1730 = 0x42b0c0a542b0c0a5;
          uStack_1728 = 0x42b0c0a542b0c0a5;
          auVar29._16_8_ = uStack_1af0;
          auVar29._0_16_ = _local_1b00;
          auVar29._24_8_ = uStack_1ae8;
          auVar28._8_8_ = 0x42b0c0a542b0c0a5;
          auVar28._0_8_ = 0x42b0c0a542b0c0a5;
          auVar28._16_8_ = 0x42b0c0a542b0c0a5;
          auVar28._24_8_ = 0x42b0c0a542b0c0a5;
          auVar7 = vminps_avx(auVar29,auVar28);
          local_1b00 = auVar7._0_8_;
          local_16a0 = local_1b00;
          uStack_1af8 = auVar7._8_8_;
          uStack_1698 = uStack_1af8;
          uStack_1af0 = auVar7._16_8_;
          uStack_1690 = uStack_1af0;
          uStack_1ae8 = auVar7._24_8_;
          uStack_1688 = uStack_1ae8;
          local_16c0 = 0xc2b0c0a5c2b0c0a5;
          uStack_16b8 = 0xc2b0c0a5c2b0c0a5;
          uStack_16b0 = 0xc2b0c0a5c2b0c0a5;
          uStack_16a8 = 0xc2b0c0a5c2b0c0a5;
          auVar32._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar32._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar32._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar32._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar8 = vmaxps_avx(auVar7,auVar32);
          local_1b00 = auVar8._0_8_;
          local_1040 = local_1b00;
          uStack_1af8 = auVar8._8_8_;
          uStack_1038 = uStack_1af8;
          uStack_1af0 = auVar8._16_8_;
          uStack_1030 = uStack_1af0;
          uStack_1ae8 = auVar8._24_8_;
          uStack_1028 = uStack_1ae8;
          local_1060 = 0x3fb8aa3b3fb8aa3b;
          uStack_1058 = 0x3fb8aa3b3fb8aa3b;
          uStack_1050 = 0x3fb8aa3b3fb8aa3b;
          uStack_1048 = 0x3fb8aa3b3fb8aa3b;
          local_1080 = 0x3f0000003f000000;
          uStack_1078 = 0x3f0000003f000000;
          uStack_1070 = 0x3f0000003f000000;
          uStack_1068 = 0x3f0000003f000000;
          local_b00 = local_1b00;
          uStack_af8 = uStack_1af8;
          uStack_af0 = uStack_1af0;
          uStack_ae8 = uStack_1ae8;
          local_b20 = 0x3fb8aa3b3fb8aa3b;
          uStack_b18 = 0x3fb8aa3b3fb8aa3b;
          uStack_b10 = 0x3fb8aa3b3fb8aa3b;
          uStack_b08 = 0x3fb8aa3b3fb8aa3b;
          local_b40 = 0x3f0000003f000000;
          uStack_b38 = 0x3f0000003f000000;
          uStack_b30 = 0x3f0000003f000000;
          uStack_b28 = 0x3f0000003f000000;
          auVar39._8_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar39._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar39._16_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar39._24_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar38._8_8_ = 0x3f0000003f000000;
          auVar38._0_8_ = 0x3f0000003f000000;
          auVar38._16_8_ = 0x3f0000003f000000;
          auVar38._24_8_ = 0x3f0000003f000000;
          auVar10 = vfmadd213ps_fma(auVar39,auVar8,auVar38);
          local_1b40 = ZEXT1632(auVar10);
          auVar9 = vroundps_avx(local_1b40,1);
          auVar7 = vcmpps_avx(local_1b40,auVar9,1);
          local_1ba0._0_8_ = auVar7._0_8_;
          local_f40 = local_1ba0._0_8_;
          local_1ba0._8_8_ = auVar7._8_8_;
          uStack_f38 = local_1ba0._8_8_;
          local_1ba0._16_8_ = auVar7._16_8_;
          uStack_f30 = local_1ba0._16_8_;
          local_1ba0._24_8_ = auVar7._24_8_;
          uStack_f28 = local_1ba0._24_8_;
          local_f60 = 0x3f8000003f800000;
          uStack_f58 = 0x3f8000003f800000;
          uStack_f50 = 0x3f8000003f800000;
          uStack_f48 = 0x3f8000003f800000;
          auVar35._8_8_ = 0x3f8000003f800000;
          auVar35._0_8_ = 0x3f8000003f800000;
          auVar35._16_8_ = 0x3f8000003f800000;
          auVar35._24_8_ = 0x3f8000003f800000;
          local_1ba0 = vandps_avx(auVar7,auVar35);
          local_1b20 = auVar9._0_8_;
          local_e80 = local_1b20;
          uStack_1b18 = auVar9._8_8_;
          uStack_e78 = uStack_1b18;
          uStack_1b10 = auVar9._16_8_;
          uStack_e70 = uStack_1b10;
          uStack_1b08 = auVar9._24_8_;
          uStack_e68 = uStack_1b08;
          local_ea0 = local_1ba0._0_8_;
          uStack_e98 = local_1ba0._8_8_;
          uStack_e90 = local_1ba0._16_8_;
          uStack_e88 = local_1ba0._24_8_;
          local_1b40 = vsubps_avx(auVar9,local_1ba0);
          local_d60 = local_1b40._0_8_;
          uStack_d58 = local_1b40._8_8_;
          uStack_d50 = local_1b40._16_8_;
          uStack_d48 = local_1b40._24_8_;
          local_da0 = local_1b00;
          uStack_d98 = uStack_1af8;
          uStack_d90 = uStack_1af0;
          uStack_d88 = uStack_1ae8;
          local_d80 = 0x3f3180003f318000;
          uStack_d78 = 0x3f3180003f318000;
          uStack_d70 = 0x3f3180003f318000;
          uStack_d68 = 0x3f3180003f318000;
          local_4c0 = 0x3f3180003f318000;
          uStack_4b8 = 0x3f3180003f318000;
          uStack_4b0 = 0x3f3180003f318000;
          uStack_4a8 = 0x3f3180003f318000;
          local_4e0 = local_1b00;
          uStack_4d8 = uStack_1af8;
          uStack_4d0 = uStack_1af0;
          uStack_4c8 = uStack_1ae8;
          local_4a0._0_4_ = local_1b40._0_4_;
          local_4a0._4_4_ = local_1b40._4_4_;
          uStack_498._0_4_ = local_1b40._8_4_;
          uStack_498._4_4_ = local_1b40._12_4_;
          uStack_490._0_4_ = local_1b40._16_4_;
          uStack_490._4_4_ = local_1b40._20_4_;
          uStack_488._0_4_ = local_1b40._24_4_;
          uStack_488._4_4_ = local_1b40._28_4_;
          auVar83._0_8_ = local_1b40._0_8_ ^ 0x8000000080000000;
          auVar83._8_4_ = -(float)uStack_498;
          auVar83._12_4_ = -uStack_498._4_4_;
          auVar83._16_4_ = -(float)uStack_490;
          auVar83._20_4_ = -uStack_490._4_4_;
          auVar83._24_4_ = -(float)uStack_488;
          auVar83._28_4_ = -uStack_488._4_4_;
          auVar67._8_8_ = 0x3f3180003f318000;
          auVar67._0_8_ = 0x3f3180003f318000;
          auVar67._16_8_ = 0x3f3180003f318000;
          auVar67._24_8_ = 0x3f3180003f318000;
          auVar10 = vfmadd213ps_fma(auVar67,auVar83,auVar8);
          local_3220 = auVar10._0_8_;
          uStack_3218 = auVar10._8_8_;
          local_dc0 = local_1b40._0_8_;
          uStack_db8 = local_1b40._8_8_;
          uStack_db0 = local_1b40._16_8_;
          uStack_da8 = local_1b40._24_8_;
          local_e00 = local_3220;
          uStack_df8 = uStack_3218;
          uStack_df0 = 0;
          uStack_de8 = 0;
          local_de0 = 0xb95e8083b95e8083;
          uStack_dd8 = 0xb95e8083b95e8083;
          uStack_dd0 = 0xb95e8083b95e8083;
          uStack_dc8 = 0xb95e8083b95e8083;
          local_440 = local_1b40._0_8_;
          uStack_438 = local_1b40._8_8_;
          uStack_430 = local_1b40._16_8_;
          uStack_428 = local_1b40._24_8_;
          local_460 = 0xb95e8083b95e8083;
          uStack_458 = 0xb95e8083b95e8083;
          uStack_450 = 0xb95e8083b95e8083;
          uStack_448 = 0xb95e8083b95e8083;
          local_480 = local_3220;
          uStack_478 = uStack_3218;
          uStack_470 = 0;
          uStack_468 = 0;
          auVar84._0_8_ = local_1b40._0_8_ ^ 0x8000000080000000;
          auVar84._8_4_ = -(float)uStack_498;
          auVar84._12_4_ = -uStack_498._4_4_;
          auVar84._16_4_ = -(float)uStack_490;
          auVar84._20_4_ = -uStack_490._4_4_;
          auVar84._24_4_ = -(float)uStack_488;
          auVar84._28_4_ = -uStack_488._4_4_;
          auVar68._8_8_ = 0xb95e8083b95e8083;
          auVar68._0_8_ = 0xb95e8083b95e8083;
          auVar68._16_8_ = 0xb95e8083b95e8083;
          auVar68._24_8_ = 0xb95e8083b95e8083;
          auVar10 = vfmadd213ps_fma(auVar68,auVar84,ZEXT1632(auVar10));
          local_3240 = auVar10._0_8_;
          uStack_3238 = auVar10._8_8_;
          _local_1b00 = ZEXT1632(auVar10);
          local_1aa0 = local_3240;
          uStack_1a98 = uStack_3238;
          uStack_1a90 = 0;
          uStack_1a88 = 0;
          local_1a80._0_4_ = auVar10._0_4_;
          local_1a80._4_4_ = auVar10._4_4_;
          uStack_1a78._0_4_ = auVar10._8_4_;
          uStack_1a78._4_4_ = auVar10._12_4_;
          local_1b20._4_4_ = local_1a80._4_4_ * local_1a80._4_4_;
          local_1b20._0_4_ = (float)local_1a80 * (float)local_1a80;
          local_12a0 = local_1b20;
          uStack_1b18._0_4_ = (float)uStack_1a78 * (float)uStack_1a78;
          uStack_1b18._4_4_ = uStack_1a78._4_4_ * uStack_1a78._4_4_;
          auVar70 = _local_1b20;
          _local_1b20 = ZEXT1632(_local_1b20);
          auVar7 = _local_1b20;
          local_10a0 = 0x3950696739506967;
          uStack_1098 = 0x3950696739506967;
          uStack_1090 = 0x3950696739506967;
          uStack_1088 = 0x3950696739506967;
          local_10c0 = local_3240;
          uStack_10b8 = uStack_3238;
          uStack_10b0 = 0;
          uStack_10a8 = 0;
          local_10e0 = 0x3ab743ce3ab743ce;
          uStack_10d8 = 0x3ab743ce3ab743ce;
          uStack_10d0 = 0x3ab743ce3ab743ce;
          uStack_10c8 = 0x3ab743ce3ab743ce;
          local_aa0 = 0x3950696739506967;
          uStack_a98 = 0x3950696739506967;
          uStack_a90 = 0x3950696739506967;
          uStack_a88 = 0x3950696739506967;
          local_ac0 = local_3240;
          uStack_ab8 = uStack_3238;
          uStack_ab0 = 0;
          uStack_aa8 = 0;
          local_ae0 = 0x3ab743ce3ab743ce;
          uStack_ad8 = 0x3ab743ce3ab743ce;
          uStack_ad0 = 0x3ab743ce3ab743ce;
          uStack_ac8 = 0x3ab743ce3ab743ce;
          auVar41._8_8_ = 0x3950696739506967;
          auVar41._0_8_ = 0x3950696739506967;
          auVar41._16_8_ = 0x3950696739506967;
          auVar41._24_8_ = 0x3950696739506967;
          auVar40._8_8_ = 0x3ab743ce3ab743ce;
          auVar40._0_8_ = 0x3ab743ce3ab743ce;
          auVar40._16_8_ = 0x3ab743ce3ab743ce;
          auVar40._24_8_ = 0x3ab743ce3ab743ce;
          auVar11 = vfmadd213ps_fma(ZEXT1632(auVar10),auVar41,auVar40);
          local_3260 = auVar11._0_8_;
          uStack_3258 = auVar11._8_8_;
          local_1100 = local_3260;
          uStack_10f8 = uStack_3258;
          uStack_10f0 = 0;
          uStack_10e8 = 0;
          local_1120 = local_3240;
          uStack_1118 = uStack_3238;
          uStack_1110 = 0;
          uStack_1108 = 0;
          local_1140 = 0x3c0889083c088908;
          uStack_1138 = 0x3c0889083c088908;
          uStack_1130 = 0x3c0889083c088908;
          uStack_1128 = 0x3c0889083c088908;
          local_a40 = local_3260;
          uStack_a38 = uStack_3258;
          uStack_a30 = 0;
          uStack_a28 = 0;
          local_a60 = local_3240;
          uStack_a58 = uStack_3238;
          uStack_a50 = 0;
          uStack_a48 = 0;
          local_a80 = 0x3c0889083c088908;
          uStack_a78 = 0x3c0889083c088908;
          uStack_a70 = 0x3c0889083c088908;
          uStack_a68 = 0x3c0889083c088908;
          auVar42._8_8_ = 0x3c0889083c088908;
          auVar42._0_8_ = 0x3c0889083c088908;
          auVar42._16_8_ = 0x3c0889083c088908;
          auVar42._24_8_ = 0x3c0889083c088908;
          auVar11 = vfmadd213ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar11),auVar42);
          local_3280 = auVar11._0_8_;
          uStack_3278 = auVar11._8_8_;
          local_1160 = local_3280;
          uStack_1158 = uStack_3278;
          uStack_1150 = 0;
          uStack_1148 = 0;
          local_1180 = local_3240;
          uStack_1178 = uStack_3238;
          uStack_1170 = 0;
          uStack_1168 = 0;
          local_11a0 = 0x3d2aa9c13d2aa9c1;
          uStack_1198 = 0x3d2aa9c13d2aa9c1;
          uStack_1190 = 0x3d2aa9c13d2aa9c1;
          uStack_1188 = 0x3d2aa9c13d2aa9c1;
          local_9e0 = local_3280;
          uStack_9d8 = uStack_3278;
          uStack_9d0 = 0;
          uStack_9c8 = 0;
          local_a00 = local_3240;
          uStack_9f8 = uStack_3238;
          uStack_9f0 = 0;
          uStack_9e8 = 0;
          local_a20 = 0x3d2aa9c13d2aa9c1;
          uStack_a18 = 0x3d2aa9c13d2aa9c1;
          uStack_a10 = 0x3d2aa9c13d2aa9c1;
          uStack_a08 = 0x3d2aa9c13d2aa9c1;
          auVar43._8_8_ = 0x3d2aa9c13d2aa9c1;
          auVar43._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar43._16_8_ = 0x3d2aa9c13d2aa9c1;
          auVar43._24_8_ = 0x3d2aa9c13d2aa9c1;
          auVar11 = vfmadd213ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar11),auVar43);
          local_32a0 = auVar11._0_8_;
          uStack_3298 = auVar11._8_8_;
          local_11c0 = local_32a0;
          uStack_11b8 = uStack_3298;
          uStack_11b0 = 0;
          uStack_11a8 = 0;
          local_11e0 = local_3240;
          uStack_11d8 = uStack_3238;
          uStack_11d0 = 0;
          uStack_11c8 = 0;
          local_1200 = 0x3e2aaaaa3e2aaaaa;
          uStack_11f8 = 0x3e2aaaaa3e2aaaaa;
          uStack_11f0 = 0x3e2aaaaa3e2aaaaa;
          uStack_11e8 = 0x3e2aaaaa3e2aaaaa;
          local_980 = local_32a0;
          uStack_978 = uStack_3298;
          uStack_970 = 0;
          uStack_968 = 0;
          local_9a0 = local_3240;
          uStack_998 = uStack_3238;
          uStack_990 = 0;
          uStack_988 = 0;
          local_9c0 = 0x3e2aaaaa3e2aaaaa;
          uStack_9b8 = 0x3e2aaaaa3e2aaaaa;
          uStack_9b0 = 0x3e2aaaaa3e2aaaaa;
          uStack_9a8 = 0x3e2aaaaa3e2aaaaa;
          auVar44._8_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar44._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar44._16_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar44._24_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar11 = vfmadd213ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar11),auVar44);
          local_32c0 = auVar11._0_8_;
          uStack_32b8 = auVar11._8_8_;
          local_1220 = local_32c0;
          uStack_1218 = uStack_32b8;
          uStack_1210 = 0;
          uStack_1208 = 0;
          local_1240 = local_3240;
          uStack_1238 = uStack_3238;
          uStack_1230 = 0;
          uStack_1228 = 0;
          local_1260 = 0x3f0000003f000000;
          uStack_1258 = 0x3f0000003f000000;
          uStack_1250 = 0x3f0000003f000000;
          uStack_1248 = 0x3f0000003f000000;
          local_920 = local_32c0;
          uStack_918 = uStack_32b8;
          uStack_910 = 0;
          uStack_908 = 0;
          local_940 = local_3240;
          uStack_938 = uStack_3238;
          uStack_930 = 0;
          uStack_928 = 0;
          local_960 = 0x3f0000003f000000;
          uStack_958 = 0x3f0000003f000000;
          uStack_950 = 0x3f0000003f000000;
          uStack_948 = 0x3f0000003f000000;
          auVar45._8_8_ = 0x3f0000003f000000;
          auVar45._0_8_ = 0x3f0000003f000000;
          auVar45._16_8_ = 0x3f0000003f000000;
          auVar45._24_8_ = 0x3f0000003f000000;
          auVar11 = vfmadd213ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar11),auVar45);
          local_32e0 = auVar11._0_8_;
          uStack_32d8 = auVar11._8_8_;
          local_1280 = local_32e0;
          uStack_1278 = uStack_32d8;
          uStack_1270 = 0;
          uStack_1268 = 0;
          uStack_1b18 = auVar70._8_8_;
          uStack_1298 = uStack_1b18;
          uStack_1290 = 0;
          uStack_1288 = 0;
          local_12c0 = local_3240;
          uStack_12b8 = uStack_3238;
          uStack_12b0 = 0;
          uStack_12a8 = 0;
          local_8c0 = local_32e0;
          uStack_8b8 = uStack_32d8;
          uStack_8b0 = 0;
          uStack_8a8 = 0;
          local_8e0 = local_12a0;
          uStack_8d8 = uStack_1b18;
          uStack_8d0 = 0;
          uStack_8c8 = 0;
          local_900 = local_3240;
          uStack_8f8 = uStack_3238;
          uStack_8f0 = 0;
          uStack_8e8 = 0;
          auVar10 = vfmadd213ps_fma(ZEXT1632(auVar70),ZEXT1632(auVar11),ZEXT1632(auVar10));
          local_3300 = auVar10._0_8_;
          uStack_32f8 = auVar10._8_8_;
          uStack_1a30 = 0;
          uStack_1a28 = 0;
          local_1a60 = 0x3f8000003f800000;
          uStack_1a58 = 0x3f8000003f800000;
          uStack_1a50 = 0x3f8000003f800000;
          uStack_1a48 = 0x3f8000003f800000;
          local_1a40._0_4_ = auVar10._0_4_;
          local_1a40._4_4_ = auVar10._4_4_;
          uStack_1a38._0_4_ = auVar10._8_4_;
          uStack_1a38._4_4_ = auVar10._12_4_;
          local_1bc0 = CONCAT44(local_1a40._4_4_ + 1.0,(float)local_1a40 + 1.0);
          uStack_1bb8 = CONCAT44(uStack_1a38._4_4_ + 1.0,(float)uStack_1a38 + 1.0);
          local_d40 = local_1b40._0_8_;
          uStack_d38 = local_1b40._8_8_;
          uStack_d30 = local_1b40._16_8_;
          uStack_d28 = local_1b40._24_8_;
          local_1b60 = CONCAT44((int)local_4a0._4_4_,(int)(float)local_4a0);
          uStack_1b58 = CONCAT44((int)uStack_498._4_4_,(int)(float)uStack_498);
          uStack_1b50 = CONCAT44((int)uStack_490._4_4_,(int)(float)uStack_490);
          uStack_1b48 = CONCAT44((int)uStack_488._4_4_,(int)(float)uStack_488);
          local_c40 = local_1b60;
          uStack_c38 = uStack_1b58;
          uStack_c30 = uStack_1b50;
          uStack_c28 = uStack_1b48;
          local_c60 = 0x7f0000007f;
          uStack_c58 = 0x7f0000007f;
          uStack_c50 = 0x7f0000007f;
          uStack_c48 = 0x7f0000007f;
          local_ce0 = local_1b60;
          uStack_cd8 = uStack_1b58;
          uStack_cd0 = uStack_1b50;
          uStack_cc8 = uStack_1b48;
          local_d00 = 0x7f0000007f;
          uStack_cf8 = 0x7f0000007f;
          uStack_cf0 = 0x7f0000007f;
          uStack_ce8 = 0x7f0000007f;
          local_c90 = 0x7f0000007f;
          uStack_c88 = 0x7f0000007f;
          local_ca0 = 0x7f0000007f;
          uStack_c98 = 0x7f0000007f;
          local_390 = local_1b60;
          uStack_388 = uStack_1b58;
          local_3a0 = 0x7f0000007f;
          uStack_398 = 0x7f0000007f;
          auVar71._8_8_ = uStack_1b58;
          auVar71._0_8_ = local_1b60;
          auVar70._8_8_ = 0x7f0000007f;
          auVar70._0_8_ = 0x7f0000007f;
          local_c70 = vpaddd_avx(auVar71,auVar70);
          local_3b0 = uStack_1b50;
          uStack_3a8 = uStack_1b48;
          local_3c0 = 0x7f0000007f;
          uStack_3b8 = 0x7f0000007f;
          auVar11._8_8_ = uStack_1b48;
          auVar11._0_8_ = uStack_1b50;
          auVar10._8_8_ = 0x7f0000007f;
          auVar10._0_8_ = 0x7f0000007f;
          local_c80 = vpaddd_avx(auVar11,auVar10);
          local_d20 = local_c70._0_8_;
          uStack_d18 = local_c70._8_8_;
          uStack_d10 = local_c80._0_8_;
          uStack_d08 = local_c80._8_8_;
          local_cc0 = local_c70._0_8_;
          uStack_cb8 = local_c70._8_8_;
          uStack_cb0 = local_c80._0_8_;
          uStack_ca8 = local_c80._8_8_;
          local_b80 = local_c70._0_8_;
          uStack_b78 = local_c70._8_8_;
          uStack_b70 = local_c80._0_8_;
          uStack_b68 = local_c80._8_8_;
          local_b84 = 0x17;
          local_c00 = local_c70._0_8_;
          uStack_bf8 = local_c70._8_8_;
          uStack_bf0 = local_c80._0_8_;
          uStack_be8 = local_c80._8_8_;
          local_350 = local_c70._0_8_;
          uStack_348 = local_c70._8_8_;
          local_354 = 0x17;
          local_ba0 = vpslld_avx(local_c70,ZEXT416(0x17));
          local_370 = local_c80._0_8_;
          uStack_368 = local_c80._8_8_;
          local_374 = 0x17;
          local_bb0 = vpslld_avx(local_c80,ZEXT416(0x17));
          local_c20 = local_ba0._0_8_;
          uStack_c18 = local_ba0._8_8_;
          uStack_c10 = local_bb0._0_8_;
          uStack_c08 = local_bb0._8_8_;
          local_be0 = local_ba0._0_8_;
          uStack_bd8 = local_ba0._8_8_;
          uStack_bd0 = local_bb0._0_8_;
          uStack_bc8 = local_bb0._8_8_;
          local_1b60 = local_ba0._0_8_;
          uStack_1b58 = local_ba0._8_8_;
          uStack_1b50 = local_bb0._0_8_;
          uStack_1b48 = local_bb0._8_8_;
          local_b60 = local_ba0._0_8_;
          uStack_b58 = local_ba0._8_8_;
          uStack_b50 = local_bb0._0_8_;
          uStack_b48 = local_bb0._8_8_;
          local_1be0 = local_ba0._0_8_;
          uStack_1bd8 = local_ba0._8_8_;
          uStack_1bd0 = local_bb0._0_8_;
          uStack_1bc8 = local_bb0._8_8_;
          local_1ac0 = local_1bc0;
          uStack_1ab8 = uStack_1bb8;
          uStack_1ab0 = 0x3f8000003f800000;
          uStack_1aa8 = 0x3f8000003f800000;
          local_1ae0._0_4_ = local_ba0._0_4_;
          local_1ae0._4_4_ = local_ba0._4_4_;
          uStack_1ad8._0_4_ = local_ba0._8_4_;
          uStack_1ad8._4_4_ = local_ba0._12_4_;
          uStack_1ad0._0_4_ = local_bb0._0_4_;
          uStack_1ad0._4_4_ = local_bb0._4_4_;
          uStack_1ac8._0_4_ = local_bb0._8_4_;
          local_1ae0._0_4_ = ((float)local_1a40 + 1.0) * (float)local_1ae0;
          local_1ae0._4_4_ = (local_1a40._4_4_ + 1.0) * local_1ae0._4_4_;
          uStack_1ad8._0_4_ = ((float)uStack_1a38 + 1.0) * (float)uStack_1ad8;
          uStack_1ad8._4_4_ = (uStack_1a38._4_4_ + 1.0) * uStack_1ad8._4_4_;
          local_1bc0 = CONCAT44(local_1ae0._4_4_,(float)local_1ae0);
          uStack_1bb8 = CONCAT44(uStack_1ad8._4_4_,(float)uStack_1ad8);
          uStack_1bb0 = CONCAT44(uStack_1ad0._4_4_ * 1.0,(float)uStack_1ad0 * 1.0);
          uStack_1ba8 = CONCAT44(0x3f800000,(float)uStack_1ac8 * 1.0);
          local_2b20 = local_1bc0;
          uStack_2b18 = uStack_1bb8;
          uStack_2b10 = uStack_1bb0;
          uStack_2b08 = uStack_1ba8;
          local_24c0 = local_1bc0;
          uStack_24b8 = uStack_1bb8;
          uStack_24b0 = uStack_1bb0;
          uStack_24a8 = uStack_1ba8;
          local_24a0._0_4_ = (float)uVar12;
          local_24a0._4_4_ = (float)((ulong)uVar12 >> 0x20);
          uStack_2498._0_4_ = (float)uVar13;
          uStack_2498._4_4_ = (float)((ulong)uVar13 >> 0x20);
          uStack_2490._0_4_ = (float)uVar14;
          uStack_2490._4_4_ = (float)((ulong)uVar14 >> 0x20);
          uStack_2488._0_4_ = (float)uVar15;
          uStack_2488._4_4_ = (undefined4)((ulong)uVar15 >> 0x20);
          local_2b00 = CONCAT44(local_24a0._4_4_ * local_1ae0._4_4_,
                                (float)local_24a0 * (float)local_1ae0);
          uStack_2af8 = CONCAT44(uStack_2498._4_4_ * uStack_1ad8._4_4_,
                                 (float)uStack_2498 * (float)uStack_1ad8);
          uStack_2af0 = CONCAT44(uStack_2490._4_4_ * uStack_1ad0._4_4_ * 1.0,
                                 (float)uStack_2490 * (float)uStack_1ad0 * 1.0);
          uStack_2ae8 = CONCAT44(uStack_2488._4_4_,(float)uStack_2488 * (float)uStack_1ac8 * 1.0);
          local_23c8 = local_29c8;
          auVar9._8_8_ = uStack_2af8;
          auVar9._0_8_ = local_2b00;
          auVar9._16_8_ = uStack_2af0;
          auVar9._24_8_ = uStack_2ae8;
          *local_29c8 = auVar9;
          local_2a18 = local_2a18 + 8;
          local_29c8 = local_29c8 + 1;
          local_24a0 = uVar12;
          uStack_2498 = uVar13;
          uStack_2490 = uVar14;
          uStack_2488 = uVar15;
          local_2480 = local_1c60._0_8_;
          uStack_2478 = local_1c60._8_8_;
          uStack_2470 = local_1c60._16_8_;
          uStack_2468 = local_1c60._24_8_;
          local_2460 = uVar16;
          uStack_2458 = uVar17;
          uStack_2450 = uVar18;
          uStack_2448 = uVar19;
          local_2400 = local_2b00;
          uStack_23f8 = uStack_2af8;
          uStack_23f0 = uStack_2af0;
          uStack_23e8 = uStack_2ae8;
          local_2320 = local_1ca0._0_8_;
          uStack_2318 = local_1ca0._8_8_;
          uStack_2310 = local_1ca0._16_8_;
          uStack_2308 = local_1ca0._24_8_;
          local_2240 = local_1a20;
          uStack_2238 = uStack_1a18;
          uStack_2230 = uStack_1a10;
          uStack_2228 = uStack_1a08;
          local_2220 = local_1c20._0_8_;
          uStack_2218 = local_1c20._8_8_;
          uStack_2210 = local_1c20._16_8_;
          uStack_2208 = local_1c20._24_8_;
          _local_1b20 = auVar7;
          local_1ae0 = local_ba0._0_8_;
          uStack_1ad8 = local_ba0._8_8_;
          uStack_1ad0 = local_bb0._0_8_;
          uStack_1ac8 = local_bb0._8_8_;
          local_1a80 = local_1aa0;
          uStack_1a78 = uStack_1a98;
          uStack_1a70 = uStack_1a90;
          uStack_1a68 = uStack_1a88;
          local_1a40 = local_3300;
          uStack_1a38 = uStack_32f8;
          local_18a0 = local_3160;
          uStack_1898 = uStack_3158;
          local_1860 = local_1880;
          uStack_1858 = uStack_1878;
          uStack_1850 = uStack_1870;
          uStack_1848 = uStack_1868;
          local_1840 = local_31a0;
          uStack_1838 = uStack_3198;
          local_1800 = local_19e0._0_8_;
          uStack_17f8 = local_19e0._8_8_;
          uStack_17f0 = local_19e0._16_8_;
          uStack_17e8 = local_19e0._24_8_;
          local_17e0 = uVar24;
          uStack_17d8 = uVar25;
          uStack_17d0 = uVar26;
          uStack_17c8 = uVar27;
          local_17a0 = uVar20;
          uStack_1798 = uVar21;
          uStack_1790 = uVar22;
          uStack_1788 = uVar23;
          local_16e0 = local_2260;
          uStack_16d8 = uStack_2258;
          uStack_16d0 = uStack_2250;
          uStack_16c8 = uStack_2248;
          local_4a0 = local_1b40._0_8_;
          uStack_498 = local_1b40._8_8_;
          uStack_490 = local_1b40._16_8_;
          uStack_488 = local_1b40._24_8_;
          local_3e0 = local_e20;
          uStack_3d8 = uStack_e18;
          uStack_3d0 = uStack_e10;
          uStack_3c8 = uStack_e08;
        }
        for (; local_1c20 = auVar80, local_1c60 = auVar79, local_1ca0 = auVar78,
            local_2a64 < local_2734; local_2a64 = local_2a64 + 1) {
          fVar81 = *(float *)*local_29c8;
          auVar1 = vfmadd213ss_fma(ZEXT416(*local_2a18),ZEXT416((uint)local_28cc),
                                   ZEXT416(*(uint *)((long)in_RDI +
                                                    *(long *)(*in_RDI + -0x18) + 0xe0)));
          dVar77 = std::pow(auVar1._0_8_,
                            (double)((ulong)*(uint *)((long)in_RDI +
                                                     *(long *)(*in_RDI + -0x18) + 0xdc) ^
                                    0x8000000080000000));
          *(float *)*local_29c8 = fVar81 * SUB84(dVar77,0);
          local_2a18 = local_2a18 + 1;
          local_29c8 = (undefined1 (*) [32])(*local_29c8 + 4);
          auVar78 = local_1ca0;
          auVar79 = local_1c60;
          auVar80 = local_1c20;
        }
      }
      local_2790 = 0;
    }
    else {
      local_26fc = -100;
      local_2790 = 1;
    }
    local_2560 = &local_28c8;
    local_1ed8 = local_2560;
    if (local_28c0 != (int *)0x0) {
      local_1edc = 0xffffffff;
      LOCK();
      local_1ee0 = *local_28c0;
      *local_28c0 = *local_28c0 + -1;
      UNLOCK();
      if (local_1ee0 == 1) {
        if (local_28a8 == (long *)0x0) {
          local_1cf0 = local_28c8;
          if (local_28c8 != (undefined4 *)0x0) {
            free(local_28c8);
          }
        }
        else {
          (**(code **)(*local_28a8 + 0x18))(local_28a8,local_28c8);
        }
      }
    }
    local_28c8 = (undefined4 *)0x0;
    local_28b8 = 0;
    local_28b0 = 0;
    local_28a0 = 0;
    local_289c = 0;
    local_2898 = 0;
    local_2894 = 0;
    local_2890 = 0;
    local_2888 = 0;
    local_28c0 = (int *)0x0;
joined_r0x01000404:
    if (local_2790 != 0) goto LAB_0100054c;
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
    local_2b24 = local_271c;
    local_2b28 = local_2720;
    local_21e8 = &local_2b70;
    local_21f0 = &local_2780;
    local_2b70 = local_2780;
    local_2b68 = local_2778;
    local_2b60 = local_2770;
    local_2b58 = local_2768;
    local_2b50 = local_2760;
    local_2b48 = local_2758;
    local_2b44 = local_2754;
    local_2b40 = local_2750;
    local_2b3c = local_274c;
    local_2b38 = local_2748;
    local_2b30 = local_2740;
    if (local_2778 != (int *)0x0) {
      local_3c = 1;
      LOCK();
      local_40 = *local_2778;
      *local_2778 = *local_2778 + 1;
      UNLOCK();
    }
    local_2b74 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) / 2;
    local_38 = local_21e8;
    if (local_2b74 < 1) {
LAB_00fff56c:
      local_2bc4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_2bc4 = local_2bc4 * local_2bc4;
      local_2bc8 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) / (float)local_2bc4;
      std::allocator<int>::allocator((allocator<int> *)0xfff5da);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_ffffffffffffcbc8,in_stack_ffffffffffffcbc0,in_stack_ffffffffffffcbb8);
      std::allocator<int>::~allocator((allocator<int> *)0xfff606);
      local_2bf0 = std::vector<int,_std::allocator<int>_>::operator[](&local_2be0,0);
      local_2bf4 = 0;
      local_2bf8 = 0;
      local_2bfc = local_271c - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      for (local_2c00 = 0; local_2c00 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_2c00 = local_2c00 + 1) {
        for (local_2c04 = 0; local_2c04 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4)
            ; local_2c04 = local_2c04 + 1) {
          local_2bf0[local_2bf4] = local_2bf8;
          local_2bf4 = local_2bf4 + 1;
          local_2bf8 = local_2bf8 + 1;
        }
        local_2bf8 = local_2bfc + local_2bf8;
      }
      for (local_2c08 = 0; local_2c08 < local_2724; local_2c08 = local_2c08 + 1) {
        local_26a8 = &local_2c58;
        local_2034 = *(int *)((long)local_2710 + 0x2c);
        local_2038 = (int)local_2710[6];
        local_203c = *(undefined4 *)((long)local_2710 + 0x34);
        local_2c10 = *local_2710 + local_2710[8] * (long)local_2c08 * local_2710[2];
        local_2050 = local_2710[2];
        local_2054 = (undefined4)local_2710[3];
        local_2060 = local_2710[4];
        local_2030 = &local_2c58;
        local_1fd8 = (long)local_2034 * (long)local_2038 * local_2050;
        local_2510 = &local_2c58;
        local_2550 = &local_2c58;
        local_1fdc = 0x10;
        local_26b4 = local_2c08;
        local_26b5 = 1;
        local_2c58 = 0;
        local_2c48 = 0;
        local_2c40 = 0;
        local_2c30 = 0;
        local_2c2c = 0;
        local_2c28 = 0;
        local_2c24 = 0;
        local_2c20 = 0;
        local_2c18 = 0;
        local_2c50 = 0;
        local_26c0 = &local_2ca0;
        local_26c8 = &local_2b70;
        local_2010 = (void *)((long)local_2b70 + local_2b30 * local_2c08 * local_2b60);
        local_1ff8 = &local_2ca0;
        local_2c98 = (int *)0x0;
        local_2c90 = local_2b60;
        local_2c88 = local_2b58;
        local_2c80 = local_2b50;
        local_2c74 = local_2b44;
        local_2c70 = local_2b40;
        local_2c6c = 1;
        local_2c68 = local_2b3c;
        local_1fe8 = (long)local_2b44 * (long)local_2b40 * local_2b60;
        local_2c60 = (local_1fe8 + 0xfU & 0xfffffffffffffff0) / local_2b60;
        local_2c78 = local_2b48 + -1;
        if (local_2b48 == 4) {
          local_2c60 = (long)local_2b44 * (long)local_2b40;
        }
        local_1fec = 0x10;
        local_2004 = local_2b3c;
        local_2018 = local_2b60;
        local_201c = local_2b58;
        local_2028 = local_2b50;
        local_26cc = local_2c08;
        local_26cd = 1;
        local_2048 = local_2c10;
        local_1ef8 = local_2550;
        local_2ca0 = local_2010;
        local_2c38 = local_2060;
        for (local_2ca4 = 0; local_2ca4 < local_2b28; local_2ca4 = local_2ca4 + 1) {
          for (local_2ca8 = 0; local_2ca8 < local_2b24; local_2ca8 = local_2ca8 + 1) {
            local_21d8 = &local_2ca0;
            local_21dc = local_2ca4;
            local_2cb4 = 0.0;
            for (local_2cb8 = 0; local_2cb8 < local_2bc4; local_2cb8 = local_2cb8 + 1) {
              local_2cb4 = *(float *)((long)local_2ca0 +
                                     (long)local_2bf0[local_2cb8] * 4 +
                                     (long)local_2ca8 * 4 +
                                     (long)local_2c74 * (long)local_2ca4 * local_2c90) + local_2cb4;
            }
            fVar81 = *(float *)(local_2c10 + (long)local_2ca8 * 4);
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_2cb4),ZEXT416((uint)local_2bc8),
                                     ZEXT416(*(uint *)((long)in_RDI +
                                                      *(long *)(*in_RDI + -0x18) + 0xe0)));
            dVar77 = std::pow(auVar1._0_8_,
                              (double)((ulong)*(uint *)((long)in_RDI +
                                                       *(long *)(*in_RDI + -0x18) + 0xdc) ^
                                      0x8000000080000000));
            *(float *)(local_2c10 + (long)local_2ca8 * 4) = fVar81 * SUB84(dVar77,0);
          }
          local_2c10 = local_2c10 + (long)local_2b24 * 4;
        }
        ppvVar85 = &local_2ca0;
        local_2540 = ppvVar85;
        local_1f18 = ppvVar85;
        if (local_2c98 != (int *)0x0) {
          local_1f1c = 0xffffffff;
          LOCK();
          local_1f20 = *local_2c98;
          *local_2c98 = *local_2c98 + -1;
          UNLOCK();
          if (local_1f20 == 1) {
            if (local_2c80 == (long *)0x0) {
              local_1cd0 = local_2ca0;
              if (local_2ca0 != (void *)0x0) {
                free(local_2ca0);
              }
            }
            else {
              (**(code **)(*local_2c80 + 0x18))(local_2c80,local_2ca0);
            }
          }
        }
        *ppvVar85 = (void *)0x0;
        ppvVar85[2] = (void *)0x0;
        *(undefined4 *)(ppvVar85 + 3) = 0;
        *(undefined4 *)(ppvVar85 + 5) = 0;
        *(undefined4 *)((long)ppvVar85 + 0x2c) = 0;
        *(undefined4 *)(ppvVar85 + 6) = 0;
        *(undefined4 *)((long)ppvVar85 + 0x34) = 0;
        *(undefined4 *)(ppvVar85 + 7) = 0;
        ppvVar85[8] = (void *)0x0;
        ppvVar85[1] = (void *)0x0;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffcbb8);
      local_2790 = 0;
    }
    else {
      local_2bc0 = *local_2718;
      uStack_2bb0 = local_2718[2];
      uStack_2ba8 = local_2718[3];
      local_2ba0 = local_2718[4];
      uStack_2b98 = local_2718[5];
      uStack_2b90 = local_2718[6];
      uStack_2b88 = local_2718[7];
      uStack_2bb8 = local_2718[2];
      copy_make_border(in_stack_ffffffffffffcbf8,in_stack_ffffffffffffcbf0,
                       (int)((ulong)in_stack_ffffffffffffcbe8 >> 0x20),
                       (int)in_stack_ffffffffffffcbe8,in_stack_ffffffffffffcbe4,
                       in_stack_ffffffffffffcbe0,in_stack_ffffffffffffcc08,in_stack_ffffffffffffcbdc
                       ,in_stack_ffffffffffffcc10);
      local_26e8 = &local_2b70;
      if (local_2b70 != (void *)0x0) {
        local_21b8 = local_26e8;
      }
      if (local_2b70 != (void *)0x0 && local_2b30 * local_2b38 != 0) {
        local_271c = local_2b44;
        local_2720 = local_2b40;
        goto LAB_00fff56c;
      }
      local_26fc = -100;
      local_2790 = 1;
    }
    ppvVar85 = &local_2b70;
    local_2530 = ppvVar85;
    local_1f38 = ppvVar85;
    if (local_2b68 != (int *)0x0) {
      local_1f3c = 0xffffffff;
      LOCK();
      local_1f40 = *local_2b68;
      *local_2b68 = *local_2b68 + -1;
      UNLOCK();
      if (local_1f40 == 1) {
        if (local_2b50 == (long *)0x0) {
          local_1cc0 = local_2b70;
          if (local_2b70 != (void *)0x0) {
            free(local_2b70);
          }
        }
        else {
          (**(code **)(*local_2b50 + 0x18))(local_2b50,local_2b70);
        }
      }
    }
    *ppvVar85 = (void *)0x0;
    ppvVar85[2] = (void *)0x0;
    *(undefined4 *)(ppvVar85 + 3) = 0;
    *(undefined4 *)(ppvVar85 + 5) = 0;
    *(undefined4 *)((long)ppvVar85 + 0x2c) = 0;
    *(undefined4 *)(ppvVar85 + 6) = 0;
    *(undefined4 *)((long)ppvVar85 + 0x34) = 0;
    *(undefined4 *)(ppvVar85 + 7) = 0;
    ppvVar85[8] = (void *)0x0;
    ppvVar85[1] = (void *)0x0;
    goto joined_r0x01000404;
  }
  local_26fc = 0;
  local_2790 = 1;
LAB_0100054c:
  ppvVar85 = &local_2780;
  if (local_2778 != (int *)0x0) {
    local_1f5c = 0xffffffff;
    LOCK();
    local_1f60 = *local_2778;
    *local_2778 = *local_2778 + -1;
    UNLOCK();
    if (local_1f60 == 1) {
      local_2520 = ppvVar85;
      local_1f58 = ppvVar85;
      if (local_2760 == (long *)0x0) {
        local_1cb0 = local_2780;
        if (local_2780 != (void *)0x0) {
          free(local_2780);
        }
      }
      else {
        (**(code **)(*local_2760 + 0x18))(local_2760,local_2780);
      }
    }
  }
  *ppvVar85 = (void *)0x0;
  ppvVar85[2] = (void *)0x0;
  *(undefined4 *)(ppvVar85 + 3) = 0;
  *(undefined4 *)(ppvVar85 + 5) = 0;
  *(undefined4 *)((long)ppvVar85 + 0x2c) = 0;
  *(undefined4 *)(ppvVar85 + 6) = 0;
  *(undefined4 *)((long)ppvVar85 + 0x34) = 0;
  *(undefined4 *)(ppvVar85 + 7) = 0;
  ppvVar85[8] = (void *)0x0;
  ppvVar85[1] = (void *)0x0;
  return local_26fc;
}

Assistant:

int LRN_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}